

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O1

void ggml_compute_forward_sigmoid(ggml_compute_params *params,ggml_tensor *dst)

{
  uint *puVar1;
  ggml_type gVar2;
  int iVar3;
  int iVar4;
  ggml_type gVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  ggml_tensor *pgVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  byte bVar28;
  byte bVar29;
  char cVar30;
  ushort uVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong in_RCX;
  char *pcVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  undefined8 uVar41;
  ggml_tensor *pgVar42;
  ggml_tensor *pgVar43;
  ggml_tensor *pgVar44;
  ggml_tensor *pgVar45;
  ggml_tensor *pgVar46;
  ggml_tensor *pgVar47;
  uint uVar48;
  ggml_tensor *pgVar49;
  ggml_tensor *pgVar50;
  ulong uVar51;
  long in_R9;
  ulong uVar52;
  int64_t ir;
  long lVar53;
  long lVar54;
  long lVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  anon_union_4_2_947300a4 u;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auStack_5c0 [64];
  undefined8 uStack_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 uStack_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  ggml_tensor *pgStack_480;
  ggml_tensor *pgStack_478;
  ggml_tensor *pgStack_470;
  long lStack_468;
  long lStack_460;
  size_t sStack_458;
  size_t sStack_450;
  size_t sStack_448;
  size_t sStack_440;
  size_t sStack_438;
  size_t sStack_430;
  ggml_tensor *pgStack_428;
  ggml_tensor *pgStack_420;
  size_t sStack_418;
  ggml_tensor *pgStack_410;
  ggml_tensor *pgStack_408;
  ggml_tensor *pgStack_400;
  ggml_tensor *pgStack_3f8;
  ggml_tensor *pgStack_3f0;
  ggml_tensor *pgStack_3e8;
  long lStack_3e0;
  long lStack_3d8;
  size_t sStack_3d0;
  size_t sStack_3c8;
  size_t sStack_3c0;
  size_t sStack_3b8;
  size_t sStack_3b0;
  size_t sStack_3a8;
  ggml_tensor *pgStack_3a0;
  ggml_tensor *pgStack_398;
  size_t sStack_390;
  ggml_tensor *pgStack_388;
  ggml_tensor *pgStack_380;
  ggml_tensor *pgStack_378;
  ggml_tensor *pgStack_370;
  ggml_tensor *pgStack_368;
  ggml_tensor *pgStack_360;
  long lStack_358;
  long lStack_350;
  size_t sStack_348;
  size_t sStack_340;
  size_t sStack_338;
  size_t sStack_330;
  size_t sStack_328;
  size_t sStack_320;
  ggml_tensor *pgStack_318;
  ggml_tensor *pgStack_310;
  size_t sStack_308;
  ggml_tensor *pgStack_300;
  ggml_tensor *pgStack_2f8;
  ggml_tensor *pgStack_2f0;
  ggml_tensor *pgStack_2e8;
  ggml_tensor *pgStack_2e0;
  ggml_tensor *pgStack_2d8;
  long lStack_2d0;
  long lStack_2c8;
  size_t sStack_2c0;
  size_t sStack_2b8;
  size_t sStack_2b0;
  size_t sStack_2a8;
  size_t sStack_2a0;
  size_t sStack_298;
  ggml_tensor *pgStack_290;
  ggml_tensor *pgStack_288;
  size_t sStack_280;
  ggml_tensor *pgStack_278;
  ggml_tensor *pgStack_270;
  
  pgVar42 = dst->src[0];
  gVar2 = pgVar42->type;
  if ((gVar2 == GGML_TYPE_F32) && (dst->type == GGML_TYPE_F32)) {
    cVar30 = ggml_is_contiguous_1(pgVar42);
    if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
       (cVar30 = ggml_are_same_shape(pgVar42,dst), cVar30 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_0012cb39;
      if (pgVar42->nb[0] == 4) {
        lVar39 = pgVar42->ne[1];
        lVar35 = pgVar42->ne[2];
        sVar6 = pgVar42->nb[1];
        sVar7 = pgVar42->nb[2];
        sVar8 = pgVar42->nb[3];
        lVar36 = dst->ne[0];
        sVar10 = dst->nb[1];
        sVar11 = dst->nb[2];
        sVar12 = dst->nb[3];
        iVar3 = params->ith;
        iVar4 = params->nth;
        lVar33 = ggml_nrows(pgVar42);
        lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
        lVar53 = iVar3 * lVar34;
        lVar34 = lVar34 + lVar53;
        if (lVar33 <= lVar34) {
          lVar34 = lVar33;
        }
        if (lVar34 <= lVar53) {
          return;
        }
        lVar35 = lVar35 * lVar39;
        pvVar9 = dst->data;
        pvVar13 = pgVar42->data;
        do {
          lVar33 = lVar53 / lVar35;
          lVar38 = lVar53 % lVar35;
          lVar55 = lVar38 / lVar39;
          lVar38 = lVar38 % lVar39;
          if (0 < lVar36) {
            lVar40 = 0;
            do {
              fVar68 = expf(-*(float *)((long)pvVar13 +
                                       lVar40 * 4 + lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8
                                       ));
              *(float *)((long)pvVar9 +
                        lVar40 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                   1.0 / (fVar68 + 1.0);
              lVar40 = lVar40 + 1;
            } while (lVar36 != lVar40);
          }
          lVar53 = lVar53 + 1;
        } while (lVar53 != lVar34);
        return;
      }
LAB_0012cb55:
      pcVar37 = "nb00 == sizeof(src0_t)";
      uVar41 = 0x56;
      goto LAB_0012cb6f;
    }
  }
  else if ((gVar2 == GGML_TYPE_F16) && (dst->type == GGML_TYPE_F16)) {
    cVar30 = ggml_is_contiguous_1(pgVar42);
    if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
       (cVar30 = ggml_are_same_shape(pgVar42,dst), cVar30 != '\0')) {
      if (dst->nb[0] == 2) {
        if (pgVar42->nb[0] == 2) {
          lVar39 = pgVar42->ne[1];
          lVar35 = pgVar42->ne[2];
          sVar6 = pgVar42->nb[1];
          sVar7 = pgVar42->nb[2];
          sVar8 = pgVar42->nb[3];
          lVar36 = dst->ne[0];
          iVar3 = params->ith;
          iVar4 = params->nth;
          lVar33 = ggml_nrows(pgVar42);
          lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
          lVar53 = iVar3 * lVar34;
          lVar34 = lVar34 + lVar53;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar34 <= lVar53) {
            return;
          }
          lVar35 = lVar35 * lVar39;
          pvVar9 = pgVar42->data;
          do {
            lVar33 = lVar53 % lVar35;
            if (0 < lVar36) {
              lVar55 = 0;
              do {
                fVar68 = expf(-*(float *)(&ggml_table_f32_f16 +
                                         (ulong)*(ushort *)
                                                 ((long)pvVar9 +
                                                 lVar55 * 2 +
                                                 (lVar33 / lVar39) * sVar7 +
                                                 (lVar33 % lVar39) * sVar6 +
                                                 (lVar53 / lVar35) * sVar8) * 4));
                auVar69 = vcvtps2ph_f16c(ZEXT416((uint)(1.0 / (fVar68 + 1.0))),0);
                vpextrw_avx(auVar69,0);
                lVar55 = lVar55 + 1;
              } while (lVar36 != lVar55);
            }
            lVar53 = lVar53 + 1;
          } while (lVar53 != lVar34);
          return;
        }
        goto LAB_0012cb55;
      }
      goto LAB_0012cb39;
    }
  }
  else if (gVar2 == GGML_TYPE_BF16) {
    gVar5 = dst->type;
    in_RCX = (ulong)gVar5;
    if (gVar5 == GGML_TYPE_F32) {
      cVar30 = ggml_is_contiguous_1(pgVar42);
      if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
         (cVar30 = ggml_are_same_shape(pgVar42,dst), cVar30 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar42->nb[0] == 2) {
            lVar39 = pgVar42->ne[1];
            lVar35 = pgVar42->ne[2];
            sVar6 = pgVar42->nb[1];
            sVar7 = pgVar42->nb[2];
            sVar8 = pgVar42->nb[3];
            lVar36 = dst->ne[0];
            sVar10 = dst->nb[1];
            sVar11 = dst->nb[2];
            sVar12 = dst->nb[3];
            iVar3 = params->ith;
            iVar4 = params->nth;
            lVar33 = ggml_nrows(pgVar42);
            lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
            lVar53 = iVar3 * lVar34;
            lVar34 = lVar34 + lVar53;
            if (lVar33 <= lVar34) {
              lVar34 = lVar33;
            }
            if (lVar34 <= lVar53) {
              return;
            }
            lVar35 = lVar35 * lVar39;
            pvVar9 = dst->data;
            pvVar13 = pgVar42->data;
            do {
              lVar33 = lVar53 / lVar35;
              lVar38 = lVar53 % lVar35;
              lVar55 = lVar38 / lVar39;
              lVar38 = lVar38 % lVar39;
              if (0 < lVar36) {
                lVar40 = 0;
                do {
                  fVar68 = expf((float)((uint)*(ushort *)
                                               ((long)pvVar13 +
                                               lVar40 * 2 +
                                               lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8) *
                                        0x10000 + -0x80000000));
                  *(float *)((long)pvVar9 +
                            lVar40 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                       1.0 / (fVar68 + 1.0);
                  lVar40 = lVar40 + 1;
                } while (lVar36 != lVar40);
              }
              lVar53 = lVar53 + 1;
            } while (lVar53 != lVar34);
            return;
          }
          goto LAB_0012cb55;
        }
        goto LAB_0012cb39;
      }
    }
    else {
      if (gVar5 != GGML_TYPE_BF16) goto LAB_0012c5f1;
      cVar30 = ggml_is_contiguous_1(pgVar42);
      if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
         (cVar30 = ggml_are_same_shape(pgVar42,dst), cVar30 != '\0')) {
        if (dst->nb[0] == 2) {
          if (pgVar42->nb[0] == 2) {
            lVar39 = pgVar42->ne[1];
            lVar35 = pgVar42->ne[2];
            sVar6 = pgVar42->nb[1];
            sVar7 = pgVar42->nb[2];
            sVar8 = pgVar42->nb[3];
            lVar36 = dst->ne[0];
            sVar10 = dst->nb[1];
            sVar11 = dst->nb[2];
            sVar12 = dst->nb[3];
            iVar3 = params->ith;
            iVar4 = params->nth;
            lVar33 = ggml_nrows(pgVar42);
            lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
            lVar53 = iVar3 * lVar34;
            lVar34 = lVar34 + lVar53;
            if (lVar33 <= lVar34) {
              lVar34 = lVar33;
            }
            if (lVar34 <= lVar53) {
              return;
            }
            lVar35 = lVar35 * lVar39;
            pvVar9 = dst->data;
            pvVar13 = pgVar42->data;
            do {
              lVar33 = lVar53 / lVar35;
              lVar38 = lVar53 % lVar35;
              lVar55 = lVar38 / lVar39;
              lVar38 = lVar38 % lVar39;
              if (0 < lVar36) {
                lVar40 = 0;
                do {
                  fVar68 = expf((float)((uint)*(ushort *)
                                               ((long)pvVar13 +
                                               lVar40 * 2 +
                                               lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8) *
                                        0x10000 + -0x80000000));
                  fVar68 = 1.0 / (fVar68 + 1.0);
                  if ((uint)ABS(fVar68) < 0x7f800001) {
                    uVar31 = (ushort)((int)fVar68 + 0x7fff + ((uint)fVar68 >> 0x10 & 1) >> 0x10);
                  }
                  else {
                    uVar31 = (ushort)((uint)fVar68 >> 0x10) | 0x40;
                  }
                  *(ushort *)
                   ((long)pvVar9 + lVar40 * 2 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12)
                       = uVar31;
                  lVar40 = lVar40 + 1;
                } while (lVar36 != lVar40);
              }
              lVar53 = lVar53 + 1;
            } while (lVar53 != lVar34);
            return;
          }
          goto LAB_0012cb55;
        }
        goto LAB_0012cb39;
      }
    }
  }
  else {
LAB_0012c5f1:
    if ((gVar2 != GGML_TYPE_F16) || (dst->type != GGML_TYPE_F32)) {
      ggml_compute_forward_sigmoid_cold_1();
      pgVar43 = pgVar42->src[0];
      gVar2 = pgVar43->type;
      if ((gVar2 == GGML_TYPE_F32) && (pgVar42->type == GGML_TYPE_F32)) {
        cVar30 = ggml_is_contiguous_1(pgVar43);
        if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
           (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
          if (pgVar42->nb[0] != 4) goto LAB_0012d47e;
          if (pgVar43->nb[0] == 4) {
            lVar39 = pgVar43->ne[1];
            lVar35 = pgVar43->ne[2];
            sVar6 = pgVar43->nb[1];
            sVar7 = pgVar43->nb[2];
            sVar8 = pgVar43->nb[3];
            lVar36 = pgVar42->ne[0];
            sVar10 = pgVar42->nb[1];
            sVar11 = pgVar42->nb[2];
            sVar12 = pgVar42->nb[3];
            gVar2 = dst->type;
            iVar3 = *(int *)&dst->field_0x4;
            lVar33 = ggml_nrows(pgVar43);
            lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
            lVar53 = (int)gVar2 * lVar34;
            lVar34 = lVar34 + lVar53;
            if (lVar33 <= lVar34) {
              lVar34 = lVar33;
            }
            if (lVar34 <= lVar53) {
              return;
            }
            lVar35 = lVar35 * lVar39;
            pvVar9 = pgVar42->data;
            pvVar13 = pgVar43->data;
            do {
              lVar33 = lVar53 / lVar35;
              lVar38 = lVar53 % lVar35;
              lVar55 = lVar38 / lVar39;
              lVar38 = lVar38 % lVar39;
              if (0 < lVar36) {
                lVar40 = 0;
                do {
                  auVar75._0_4_ =
                       (*(float *)((long)pvVar13 +
                                  lVar40 * 4 + lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8) +
                       3.0) / 6.0;
                  auVar75._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar69 = vmaxss_avx(auVar75,ZEXT816(0) << 0x40);
                  auVar69 = vminss_avx(auVar69,SUB6416(ZEXT464(0x3f800000),0));
                  *(int *)((long)pvVar9 +
                          lVar40 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                       auVar69._0_4_;
                  lVar40 = lVar40 + 1;
                } while (lVar36 != lVar40);
              }
              lVar53 = lVar53 + 1;
            } while (lVar53 != lVar34);
            return;
          }
LAB_0012d49a:
          pcVar37 = "nb00 == sizeof(src0_t)";
          uVar41 = 0x56;
          goto LAB_0012d4b4;
        }
      }
      else if ((gVar2 == GGML_TYPE_F16) && (pgVar42->type == GGML_TYPE_F16)) {
        cVar30 = ggml_is_contiguous_1(pgVar43);
        if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
           (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
          if (pgVar42->nb[0] == 2) {
            if (pgVar43->nb[0] == 2) {
              lVar39 = pgVar43->ne[1];
              lVar35 = pgVar43->ne[2];
              sVar6 = pgVar43->nb[1];
              sVar7 = pgVar43->nb[2];
              sVar8 = pgVar43->nb[3];
              lVar36 = pgVar42->ne[0];
              gVar2 = dst->type;
              iVar3 = *(int *)&dst->field_0x4;
              lVar33 = ggml_nrows();
              lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
              lVar53 = (int)gVar2 * lVar34;
              lVar34 = lVar34 + lVar53;
              if (lVar33 <= lVar34) {
                lVar34 = lVar33;
              }
              if (lVar34 <= lVar53) {
                return;
              }
              lVar35 = lVar35 * lVar39;
              do {
                lVar33 = lVar53 % lVar35;
                if (0 < lVar36) {
                  lVar55 = 0;
                  do {
                    auVar72._0_4_ =
                         (*(float *)(&ggml_table_f32_f16 +
                                    (ulong)*(ushort *)
                                            ((long)pgVar43->data +
                                            lVar55 * 2 +
                                            (lVar33 / lVar39) * sVar7 +
                                            (lVar33 % lVar39) * sVar6 + (lVar53 / lVar35) * sVar8) *
                                    4) + 3.0) / 6.0;
                    auVar72._4_12_ = SUB6012((undefined1  [60])0x0,0);
                    auVar69 = vmaxss_avx(auVar72,ZEXT816(0) << 0x40);
                    auVar69 = vminss_avx(auVar69,SUB6416(ZEXT464(0x3f800000),0));
                    auVar69 = vcvtps2ph_f16c(auVar69,0);
                    vpextrw_avx(auVar69,0);
                    lVar55 = lVar55 + 1;
                  } while (lVar36 != lVar55);
                }
                lVar53 = lVar53 + 1;
              } while (lVar53 != lVar34);
              return;
            }
            goto LAB_0012d49a;
          }
          goto LAB_0012d47e;
        }
      }
      else if (gVar2 == GGML_TYPE_BF16) {
        gVar5 = pgVar42->type;
        in_RCX = (ulong)gVar5;
        if (gVar5 == GGML_TYPE_F32) {
          cVar30 = ggml_is_contiguous_1(pgVar43);
          if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
             (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
            if (pgVar42->nb[0] == 4) {
              if (pgVar43->nb[0] == 2) {
                lVar39 = pgVar43->ne[1];
                lVar35 = pgVar43->ne[2];
                sVar6 = pgVar43->nb[1];
                sVar7 = pgVar43->nb[2];
                sVar8 = pgVar43->nb[3];
                lVar36 = pgVar42->ne[0];
                sVar10 = pgVar42->nb[1];
                sVar11 = pgVar42->nb[2];
                sVar12 = pgVar42->nb[3];
                gVar2 = dst->type;
                iVar3 = *(int *)&dst->field_0x4;
                lVar33 = ggml_nrows(pgVar43);
                lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                lVar53 = (int)gVar2 * lVar34;
                lVar34 = lVar34 + lVar53;
                if (lVar33 <= lVar34) {
                  lVar34 = lVar33;
                }
                if (lVar34 <= lVar53) {
                  return;
                }
                lVar35 = lVar35 * lVar39;
                pvVar9 = pgVar42->data;
                pvVar13 = pgVar43->data;
                auVar67 = vpbroadcastq_avx512f();
                auVar63 = vbroadcastss_avx512f(ZEXT416(0x40400000));
                auVar64 = vbroadcastss_avx512f(ZEXT416(0x40c00000));
                auVar65 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                auVar66 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                auVar60 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                do {
                  lVar33 = lVar53 / lVar35;
                  lVar38 = lVar53 % lVar35;
                  lVar55 = lVar38 / lVar39;
                  lVar38 = lVar38 % lVar39;
                  if (0 < lVar36) {
                    uVar52 = 0;
                    do {
                      auVar61 = vpbroadcastq_avx512f();
                      auVar62 = vporq_avx512f(auVar61,auVar65);
                      auVar61 = vporq_avx512f(auVar61,auVar66);
                      uVar41 = vpcmpuq_avx512f(auVar61,auVar67,2);
                      bVar28 = (byte)uVar41;
                      uVar41 = vpcmpuq_avx512f(auVar62,auVar67,2);
                      bVar29 = (byte)uVar41;
                      uVar31 = CONCAT11(bVar29,bVar28);
                      auVar59 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                    ((long)pvVar13 +
                                                    uVar52 * 2 +
                                                    lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8
                                                    ));
                      auVar56._2_2_ = (ushort)((byte)(uVar31 >> 1) & 1) * auVar59._2_2_;
                      auVar56._0_2_ = (ushort)(bVar28 & 1) * auVar59._0_2_;
                      auVar56._4_2_ = (ushort)((byte)(uVar31 >> 2) & 1) * auVar59._4_2_;
                      auVar56._6_2_ = (ushort)((byte)(uVar31 >> 3) & 1) * auVar59._6_2_;
                      auVar56._8_2_ = (ushort)((byte)(uVar31 >> 4) & 1) * auVar59._8_2_;
                      auVar56._10_2_ = (ushort)((byte)(uVar31 >> 5) & 1) * auVar59._10_2_;
                      auVar56._12_2_ = (ushort)((byte)(uVar31 >> 6) & 1) * auVar59._12_2_;
                      auVar56._14_2_ = (ushort)((byte)(uVar31 >> 7) & 1) * auVar59._14_2_;
                      auVar56._16_2_ = (ushort)(bVar29 & 1) * auVar59._16_2_;
                      auVar56._18_2_ = (ushort)(bVar29 >> 1 & 1) * auVar59._18_2_;
                      auVar56._20_2_ = (ushort)(bVar29 >> 2 & 1) * auVar59._20_2_;
                      auVar56._22_2_ = (ushort)(bVar29 >> 3 & 1) * auVar59._22_2_;
                      auVar56._24_2_ = (ushort)(bVar29 >> 4 & 1) * auVar59._24_2_;
                      auVar56._26_2_ = (ushort)(bVar29 >> 5 & 1) * auVar59._26_2_;
                      auVar56._28_2_ = (ushort)(bVar29 >> 6 & 1) * auVar59._28_2_;
                      auVar56._30_2_ = (ushort)(bVar29 >> 7) * auVar59._30_2_;
                      auVar61 = vpmovzxwd_avx512f(auVar56);
                      auVar61 = vpslld_avx512f(auVar61,0x10);
                      auVar61 = vaddps_avx512f(auVar61,auVar63);
                      auVar61 = vdivps_avx512f(auVar61,auVar64);
                      auVar61 = vmaxps_avx512f(auVar61,ZEXT1664(ZEXT816(0) << 0x40));
                      auVar61 = vminps_avx512f(auVar61,auVar60);
                      puVar1 = (uint *)((long)pvVar9 +
                                       uVar52 * 4 +
                                       lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12);
                      bVar15 = (bool)((byte)(uVar31 >> 1) & 1);
                      bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
                      bVar17 = (bool)((byte)(uVar31 >> 3) & 1);
                      bVar18 = (bool)((byte)(uVar31 >> 4) & 1);
                      bVar19 = (bool)((byte)(uVar31 >> 5) & 1);
                      bVar20 = (bool)((byte)(uVar31 >> 6) & 1);
                      bVar21 = (bool)((byte)(uVar31 >> 7) & 1);
                      bVar22 = (bool)(bVar29 >> 1 & 1);
                      bVar23 = (bool)(bVar29 >> 2 & 1);
                      bVar24 = (bool)(bVar29 >> 3 & 1);
                      bVar25 = (bool)(bVar29 >> 4 & 1);
                      bVar26 = (bool)(bVar29 >> 5 & 1);
                      bVar27 = (bool)(bVar29 >> 6 & 1);
                      *puVar1 = (uint)(bVar28 & 1) * auVar61._0_4_ |
                                (uint)!(bool)(bVar28 & 1) * *puVar1;
                      puVar1[1] = (uint)bVar15 * auVar61._4_4_ | (uint)!bVar15 * puVar1[1];
                      puVar1[2] = (uint)bVar16 * auVar61._8_4_ | (uint)!bVar16 * puVar1[2];
                      puVar1[3] = (uint)bVar17 * auVar61._12_4_ | (uint)!bVar17 * puVar1[3];
                      puVar1[4] = (uint)bVar18 * auVar61._16_4_ | (uint)!bVar18 * puVar1[4];
                      puVar1[5] = (uint)bVar19 * auVar61._20_4_ | (uint)!bVar19 * puVar1[5];
                      puVar1[6] = (uint)bVar20 * auVar61._24_4_ | (uint)!bVar20 * puVar1[6];
                      puVar1[7] = (uint)bVar21 * auVar61._28_4_ | (uint)!bVar21 * puVar1[7];
                      puVar1[8] = (uint)(bVar29 & 1) * auVar61._32_4_ |
                                  (uint)!(bool)(bVar29 & 1) * puVar1[8];
                      puVar1[9] = (uint)bVar22 * auVar61._36_4_ | (uint)!bVar22 * puVar1[9];
                      puVar1[10] = (uint)bVar23 * auVar61._40_4_ | (uint)!bVar23 * puVar1[10];
                      puVar1[0xb] = (uint)bVar24 * auVar61._44_4_ | (uint)!bVar24 * puVar1[0xb];
                      puVar1[0xc] = (uint)bVar25 * auVar61._48_4_ | (uint)!bVar25 * puVar1[0xc];
                      puVar1[0xd] = (uint)bVar26 * auVar61._52_4_ | (uint)!bVar26 * puVar1[0xd];
                      puVar1[0xe] = (uint)bVar27 * auVar61._56_4_ | (uint)!bVar27 * puVar1[0xe];
                      puVar1[0xf] = (uint)(bVar29 >> 7) * auVar61._60_4_ |
                                    (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                      uVar52 = uVar52 + 0x10;
                    } while ((lVar36 + 0xfU & 0xfffffffffffffff0) != uVar52);
                  }
                  lVar53 = lVar53 + 1;
                } while (lVar53 != lVar34);
                return;
              }
              goto LAB_0012d49a;
            }
            goto LAB_0012d47e;
          }
        }
        else {
          if (gVar5 != GGML_TYPE_BF16) goto LAB_0012cf3f;
          cVar30 = ggml_is_contiguous_1(pgVar43);
          if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
             (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
            if (pgVar42->nb[0] == 2) {
              if (pgVar43->nb[0] == 2) {
                lVar39 = pgVar43->ne[1];
                lVar35 = pgVar43->ne[2];
                sVar6 = pgVar43->nb[1];
                sVar7 = pgVar43->nb[2];
                sVar8 = pgVar43->nb[3];
                lVar36 = pgVar42->ne[0];
                sVar10 = pgVar42->nb[1];
                sVar11 = pgVar42->nb[2];
                sVar12 = pgVar42->nb[3];
                gVar2 = dst->type;
                iVar3 = *(int *)&dst->field_0x4;
                lVar33 = ggml_nrows(pgVar43);
                lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                lVar53 = (int)gVar2 * lVar34;
                lVar34 = lVar34 + lVar53;
                if (lVar33 <= lVar34) {
                  lVar34 = lVar33;
                }
                if (lVar34 <= lVar53) {
                  return;
                }
                lVar35 = lVar35 * lVar39;
                pvVar9 = pgVar42->data;
                pvVar13 = pgVar43->data;
                do {
                  lVar33 = lVar53 / lVar35;
                  lVar38 = lVar53 % lVar35;
                  lVar55 = lVar38 / lVar39;
                  lVar38 = lVar38 % lVar39;
                  if (0 < lVar36) {
                    lVar40 = 0;
                    do {
                      auVar73._0_4_ =
                           ((float)((uint)*(ushort *)
                                           ((long)pvVar13 +
                                           lVar40 * 2 +
                                           lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8) << 0x10
                                   ) + 3.0) / 6.0;
                      auVar73._4_12_ = SUB6012((undefined1  [60])0x0,0);
                      auVar69 = vmaxss_avx(auVar73,ZEXT816(0) << 0x40);
                      auVar69 = vminss_avx(auVar69,SUB6416(ZEXT464(0x3f800000),0));
                      uVar32 = auVar69._0_4_;
                      if ((uVar32 & 0x7fffffff) < 0x7f800001) {
                        uVar31 = (ushort)(uVar32 + 0x7fff + (uVar32 >> 0x10 & 1) >> 0x10);
                      }
                      else {
                        uVar31 = auVar69._2_2_ | 0x40;
                      }
                      *(ushort *)
                       ((long)pvVar9 +
                       lVar40 * 2 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) = uVar31;
                      lVar40 = lVar40 + 1;
                    } while (lVar36 != lVar40);
                  }
                  lVar53 = lVar53 + 1;
                } while (lVar53 != lVar34);
                return;
              }
              goto LAB_0012d49a;
            }
            goto LAB_0012d47e;
          }
        }
      }
      else {
LAB_0012cf3f:
        if ((gVar2 != GGML_TYPE_F16) || (pgVar42->type != GGML_TYPE_F32)) {
          ggml_compute_forward_hardsigmoid_cold_1();
          pgVar44 = pgVar43->src[0];
          gVar2 = pgVar44->type;
          if ((gVar2 == GGML_TYPE_F32) && (pgVar43->type == GGML_TYPE_F32)) {
            cVar30 = ggml_is_contiguous_1(pgVar44);
            if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
               (cVar30 = ggml_are_same_shape(pgVar44,pgVar43), cVar30 != '\0')) {
              if (pgVar43->nb[0] != 4) goto LAB_0012dd5e;
              if (pgVar44->nb[0] == 4) {
                lVar39 = pgVar44->ne[1];
                lVar35 = pgVar44->ne[2];
                sVar6 = pgVar44->nb[1];
                sVar7 = pgVar44->nb[2];
                sVar8 = pgVar44->nb[3];
                lVar36 = pgVar43->ne[0];
                sVar10 = pgVar43->nb[1];
                sVar11 = pgVar43->nb[2];
                sVar12 = pgVar43->nb[3];
                gVar2 = pgVar42->type;
                iVar3 = *(int *)&pgVar42->field_0x4;
                lVar33 = ggml_nrows(pgVar44);
                lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                lVar53 = (int)gVar2 * lVar34;
                lVar34 = lVar34 + lVar53;
                if (lVar33 <= lVar34) {
                  lVar34 = lVar33;
                }
                if (lVar34 <= lVar53) {
                  return;
                }
                lVar35 = lVar35 * lVar39;
                pvVar9 = pgVar43->data;
                pvVar13 = pgVar44->data;
                do {
                  lVar33 = lVar53 / lVar35;
                  lVar38 = lVar53 % lVar35;
                  lVar55 = lVar38 / lVar39;
                  lVar38 = lVar38 % lVar39;
                  if (0 < lVar36) {
                    lVar40 = 0;
                    do {
                      fVar68 = expf(*(float *)((long)pvVar13 +
                                              lVar40 * 4 +
                                              lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8));
                      *(float *)((long)pvVar9 +
                                lVar40 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                           fVar68;
                      lVar40 = lVar40 + 1;
                    } while (lVar36 != lVar40);
                  }
                  lVar53 = lVar53 + 1;
                } while (lVar53 != lVar34);
                return;
              }
LAB_0012dd7a:
              pcVar37 = "nb00 == sizeof(src0_t)";
              uVar41 = 0x56;
              goto LAB_0012dd94;
            }
          }
          else if ((gVar2 == GGML_TYPE_F16) && (pgVar43->type == GGML_TYPE_F16)) {
            cVar30 = ggml_is_contiguous_1(pgVar44);
            if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
               (cVar30 = ggml_are_same_shape(pgVar44,pgVar43), cVar30 != '\0')) {
              if (pgVar43->nb[0] == 2) {
                if (pgVar44->nb[0] == 2) {
                  lVar39 = pgVar44->ne[1];
                  lVar35 = pgVar44->ne[2];
                  sVar6 = pgVar44->nb[1];
                  sVar7 = pgVar44->nb[2];
                  sVar8 = pgVar44->nb[3];
                  lVar36 = pgVar43->ne[0];
                  gVar2 = pgVar42->type;
                  iVar3 = *(int *)&pgVar42->field_0x4;
                  lVar33 = ggml_nrows(pgVar44);
                  lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                  lVar53 = (int)gVar2 * lVar34;
                  lVar34 = lVar34 + lVar53;
                  if (lVar33 <= lVar34) {
                    lVar34 = lVar33;
                  }
                  if (lVar34 <= lVar53) {
                    return;
                  }
                  lVar35 = lVar35 * lVar39;
                  pvVar9 = pgVar44->data;
                  do {
                    lVar33 = lVar53 % lVar35;
                    if (0 < lVar36) {
                      lVar55 = 0;
                      do {
                        auVar60._0_4_ =
                             expf(*(float *)(&ggml_table_f32_f16 +
                                            (ulong)*(ushort *)
                                                    ((long)pvVar9 +
                                                    lVar55 * 2 +
                                                    (lVar33 / lVar39) * sVar7 +
                                                    (lVar33 % lVar39) * sVar6 +
                                                    (lVar53 / lVar35) * sVar8) * 4));
                        auVar60._4_60_ = extraout_var;
                        auVar69 = vcvtps2ph_f16c(auVar60._0_16_,0);
                        vpextrw_avx(auVar69,0);
                        lVar55 = lVar55 + 1;
                      } while (lVar36 != lVar55);
                    }
                    lVar53 = lVar53 + 1;
                  } while (lVar53 != lVar34);
                  return;
                }
                goto LAB_0012dd7a;
              }
              goto LAB_0012dd5e;
            }
          }
          else if (gVar2 == GGML_TYPE_BF16) {
            gVar5 = pgVar43->type;
            in_RCX = (ulong)gVar5;
            if (gVar5 == GGML_TYPE_F32) {
              cVar30 = ggml_is_contiguous_1(pgVar44);
              if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
                 (cVar30 = ggml_are_same_shape(pgVar44,pgVar43), cVar30 != '\0')) {
                if (pgVar43->nb[0] == 4) {
                  if (pgVar44->nb[0] == 2) {
                    lVar39 = pgVar44->ne[1];
                    lVar35 = pgVar44->ne[2];
                    sVar6 = pgVar44->nb[1];
                    sVar7 = pgVar44->nb[2];
                    sVar8 = pgVar44->nb[3];
                    lVar36 = pgVar43->ne[0];
                    sVar10 = pgVar43->nb[1];
                    sVar11 = pgVar43->nb[2];
                    sVar12 = pgVar43->nb[3];
                    gVar2 = pgVar42->type;
                    iVar3 = *(int *)&pgVar42->field_0x4;
                    lVar33 = ggml_nrows(pgVar44);
                    lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                    lVar53 = (int)gVar2 * lVar34;
                    lVar34 = lVar34 + lVar53;
                    if (lVar33 <= lVar34) {
                      lVar34 = lVar33;
                    }
                    if (lVar34 <= lVar53) {
                      return;
                    }
                    lVar35 = lVar35 * lVar39;
                    pvVar9 = pgVar43->data;
                    pvVar13 = pgVar44->data;
                    do {
                      lVar33 = lVar53 / lVar35;
                      lVar38 = lVar53 % lVar35;
                      lVar55 = lVar38 / lVar39;
                      lVar38 = lVar38 % lVar39;
                      if (0 < lVar36) {
                        lVar40 = 0;
                        do {
                          fVar68 = expf((float)((uint)*(ushort *)
                                                       ((long)pvVar13 +
                                                       lVar40 * 2 +
                                                       lVar55 * sVar7 +
                                                       lVar38 * sVar6 + lVar33 * sVar8) << 0x10));
                          *(float *)((long)pvVar9 +
                                    lVar40 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12
                                    ) = fVar68;
                          lVar40 = lVar40 + 1;
                        } while (lVar36 != lVar40);
                      }
                      lVar53 = lVar53 + 1;
                    } while (lVar53 != lVar34);
                    return;
                  }
                  goto LAB_0012dd7a;
                }
                goto LAB_0012dd5e;
              }
            }
            else {
              if (gVar5 != GGML_TYPE_BF16) goto LAB_0012d87b;
              cVar30 = ggml_is_contiguous_1(pgVar44);
              if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
                 (cVar30 = ggml_are_same_shape(pgVar44,pgVar43), cVar30 != '\0')) {
                if (pgVar43->nb[0] == 2) {
                  if (pgVar44->nb[0] == 2) {
                    lVar39 = pgVar44->ne[1];
                    lVar35 = pgVar44->ne[2];
                    sVar6 = pgVar44->nb[1];
                    sVar7 = pgVar44->nb[2];
                    sVar8 = pgVar44->nb[3];
                    lVar36 = pgVar43->ne[0];
                    sVar10 = pgVar43->nb[1];
                    sVar11 = pgVar43->nb[2];
                    sVar12 = pgVar43->nb[3];
                    gVar2 = pgVar42->type;
                    iVar3 = *(int *)&pgVar42->field_0x4;
                    lVar33 = ggml_nrows(pgVar44);
                    lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                    lVar53 = (int)gVar2 * lVar34;
                    lVar34 = lVar34 + lVar53;
                    if (lVar33 <= lVar34) {
                      lVar34 = lVar33;
                    }
                    if (lVar34 <= lVar53) {
                      return;
                    }
                    lVar35 = lVar35 * lVar39;
                    pvVar9 = pgVar43->data;
                    pvVar13 = pgVar44->data;
                    do {
                      lVar33 = lVar53 / lVar35;
                      lVar38 = lVar53 % lVar35;
                      lVar55 = lVar38 / lVar39;
                      lVar38 = lVar38 % lVar39;
                      if (0 < lVar36) {
                        lVar40 = 0;
                        do {
                          fVar68 = expf((float)((uint)*(ushort *)
                                                       ((long)pvVar13 +
                                                       lVar40 * 2 +
                                                       lVar55 * sVar7 +
                                                       lVar38 * sVar6 + lVar33 * sVar8) << 0x10));
                          if ((uint)ABS(fVar68) < 0x7f800001) {
                            uVar31 = (ushort)((int)fVar68 + 0x7fff + ((uint)fVar68 >> 0x10 & 1) >>
                                             0x10);
                          }
                          else {
                            uVar31 = (ushort)((uint)fVar68 >> 0x10) | 0x40;
                          }
                          *(ushort *)
                           ((long)pvVar9 +
                           lVar40 * 2 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                               uVar31;
                          lVar40 = lVar40 + 1;
                        } while (lVar36 != lVar40);
                      }
                      lVar53 = lVar53 + 1;
                    } while (lVar53 != lVar34);
                    return;
                  }
                  goto LAB_0012dd7a;
                }
                goto LAB_0012dd5e;
              }
            }
          }
          else {
LAB_0012d87b:
            if ((gVar2 != GGML_TYPE_F16) || (pgVar43->type != GGML_TYPE_F32)) {
              ggml_compute_forward_exp_cold_1();
              pgVar42 = pgVar44->src[0];
              gVar2 = pgVar42->type;
              if ((gVar2 == GGML_TYPE_F32) && (pgVar44->type == GGML_TYPE_F32)) {
                cVar30 = ggml_is_contiguous_1(pgVar42);
                if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0'))
                   && (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                  if (pgVar44->nb[0] != 4) goto LAB_0012e6c9;
                  if (pgVar42->nb[0] == 4) {
                    lVar39 = pgVar42->ne[1];
                    lVar35 = pgVar42->ne[2];
                    sVar6 = pgVar42->nb[1];
                    sVar7 = pgVar42->nb[2];
                    sVar8 = pgVar42->nb[3];
                    lVar36 = pgVar44->ne[0];
                    sVar10 = pgVar44->nb[1];
                    sVar11 = pgVar44->nb[2];
                    sVar12 = pgVar44->nb[3];
                    gVar2 = pgVar43->type;
                    iVar3 = *(int *)&pgVar43->field_0x4;
                    lVar33 = ggml_nrows(pgVar42);
                    lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                    lVar53 = (int)gVar2 * lVar34;
                    lVar34 = lVar34 + lVar53;
                    if (lVar33 <= lVar34) {
                      lVar34 = lVar33;
                    }
                    if (lVar34 <= lVar53) {
                      return;
                    }
                    lVar35 = lVar35 * lVar39;
                    pvVar9 = pgVar44->data;
                    pvVar13 = pgVar42->data;
                    do {
                      lVar33 = lVar53 / lVar35;
                      lVar38 = lVar53 % lVar35;
                      lVar55 = lVar38 / lVar39;
                      lVar38 = lVar38 % lVar39;
                      if (0 < lVar36) {
                        lVar40 = 0;
                        do {
                          fVar68 = *(float *)((long)pvVar13 +
                                             lVar40 * 4 +
                                             lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8);
                          auVar78._0_4_ = (fVar68 + 3.0) / 6.0;
                          auVar78._4_12_ = SUB6012((undefined1  [60])0x0,0);
                          auVar69 = vmaxss_avx(auVar78,ZEXT816(0) << 0x40);
                          auVar69 = vminss_avx(auVar69,SUB6416(ZEXT464(0x3f800000),0));
                          *(float *)((long)pvVar9 +
                                    lVar40 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12
                                    ) = fVar68 * auVar69._0_4_;
                          lVar40 = lVar40 + 1;
                        } while (lVar36 != lVar40);
                      }
                      lVar53 = lVar53 + 1;
                    } while (lVar53 != lVar34);
                    return;
                  }
LAB_0012e6e5:
                  pcVar37 = "nb00 == sizeof(src0_t)";
                  uVar41 = 0x56;
                  goto LAB_0012e6ff;
                }
              }
              else if ((gVar2 == GGML_TYPE_F16) && (pgVar44->type == GGML_TYPE_F16)) {
                cVar30 = ggml_is_contiguous_1(pgVar42);
                if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0'))
                   && (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                  if (pgVar44->nb[0] == 2) {
                    if (pgVar42->nb[0] == 2) {
                      lVar39 = pgVar42->ne[1];
                      lVar35 = pgVar42->ne[2];
                      sVar6 = pgVar42->nb[1];
                      sVar7 = pgVar42->nb[2];
                      sVar8 = pgVar42->nb[3];
                      lVar36 = pgVar44->ne[0];
                      gVar2 = pgVar43->type;
                      iVar3 = *(int *)&pgVar43->field_0x4;
                      lVar33 = ggml_nrows();
                      lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                      lVar53 = (int)gVar2 * lVar34;
                      lVar34 = lVar34 + lVar53;
                      if (lVar33 <= lVar34) {
                        lVar34 = lVar33;
                      }
                      if (lVar34 <= lVar53) {
                        return;
                      }
                      lVar35 = lVar35 * lVar39;
                      do {
                        lVar33 = lVar53 % lVar35;
                        if (0 < lVar36) {
                          lVar55 = 0;
                          do {
                            auVar76._0_4_ =
                                 (*(float *)(&ggml_table_f32_f16 +
                                            (ulong)*(ushort *)
                                                    ((long)pgVar42->data +
                                                    lVar55 * 2 +
                                                    (lVar33 / lVar39) * sVar7 +
                                                    (lVar33 % lVar39) * sVar6 +
                                                    (lVar53 / lVar35) * sVar8) * 4) + 3.0) / 6.0;
                            auVar76._4_12_ = SUB6012((undefined1  [60])0x0,0);
                            auVar69 = vmaxss_avx(auVar76,ZEXT816(0) << 0x40);
                            auVar69 = vminss_avx(auVar69,SUB6416(ZEXT464(0x3f800000),0));
                            auVar69 = vcvtps2ph_f16c(ZEXT416((uint)(*(float *)(&ggml_table_f32_f16 +
                                                                              (ulong)*(ushort *)
                                                                                      ((long)pgVar42
                                                  ->data + lVar55 * 2 +
                                                           (lVar33 / lVar39) * sVar7 +
                                                           (lVar33 % lVar39) * sVar6 +
                                                           (lVar53 / lVar35) * sVar8) * 4) *
                                                  auVar69._0_4_)),0);
                            vpextrw_avx(auVar69,0);
                            lVar55 = lVar55 + 1;
                          } while (lVar36 != lVar55);
                        }
                        lVar53 = lVar53 + 1;
                      } while (lVar53 != lVar34);
                      return;
                    }
                    goto LAB_0012e6e5;
                  }
                  goto LAB_0012e6c9;
                }
              }
              else if (gVar2 == GGML_TYPE_BF16) {
                gVar5 = pgVar44->type;
                in_RCX = (ulong)gVar5;
                if (gVar5 == GGML_TYPE_F32) {
                  cVar30 = ggml_is_contiguous_1(pgVar42);
                  if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0'))
                     && (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                    if (pgVar44->nb[0] == 4) {
                      if (pgVar42->nb[0] == 2) {
                        lVar39 = pgVar42->ne[1];
                        lVar35 = pgVar42->ne[2];
                        sVar6 = pgVar42->nb[1];
                        sVar7 = pgVar42->nb[2];
                        sVar8 = pgVar42->nb[3];
                        lVar36 = pgVar44->ne[0];
                        sVar10 = pgVar44->nb[1];
                        sVar11 = pgVar44->nb[2];
                        sVar12 = pgVar44->nb[3];
                        gVar2 = pgVar43->type;
                        iVar3 = *(int *)&pgVar43->field_0x4;
                        lVar33 = ggml_nrows(pgVar42);
                        lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                        lVar53 = (int)gVar2 * lVar34;
                        lVar34 = lVar34 + lVar53;
                        if (lVar33 <= lVar34) {
                          lVar34 = lVar33;
                        }
                        if (lVar34 <= lVar53) {
                          return;
                        }
                        lVar35 = lVar35 * lVar39;
                        pvVar9 = pgVar44->data;
                        pvVar13 = pgVar42->data;
                        auVar67 = vpbroadcastq_avx512f();
                        auVar63 = vbroadcastss_avx512f(ZEXT416(0x40400000));
                        auVar64 = vbroadcastss_avx512f(ZEXT416(0x40c00000));
                        auVar65 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                        auVar66 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        auVar60 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                        do {
                          lVar33 = lVar53 / lVar35;
                          lVar38 = lVar53 % lVar35;
                          lVar55 = lVar38 / lVar39;
                          lVar38 = lVar38 % lVar39;
                          if (0 < lVar36) {
                            uVar52 = 0;
                            do {
                              auVar61 = vpbroadcastq_avx512f();
                              auVar62 = vporq_avx512f(auVar61,auVar65);
                              auVar61 = vporq_avx512f(auVar61,auVar66);
                              uVar41 = vpcmpuq_avx512f(auVar61,auVar67,2);
                              bVar28 = (byte)uVar41;
                              uVar41 = vpcmpuq_avx512f(auVar62,auVar67,2);
                              bVar29 = (byte)uVar41;
                              uVar31 = CONCAT11(bVar29,bVar28);
                              auVar59 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                            ((long)pvVar13 +
                                                            uVar52 * 2 +
                                                            lVar55 * sVar7 +
                                                            lVar38 * sVar6 + lVar33 * sVar8));
                              auVar57._2_2_ = (ushort)((byte)(uVar31 >> 1) & 1) * auVar59._2_2_;
                              auVar57._0_2_ = (ushort)(bVar28 & 1) * auVar59._0_2_;
                              auVar57._4_2_ = (ushort)((byte)(uVar31 >> 2) & 1) * auVar59._4_2_;
                              auVar57._6_2_ = (ushort)((byte)(uVar31 >> 3) & 1) * auVar59._6_2_;
                              auVar57._8_2_ = (ushort)((byte)(uVar31 >> 4) & 1) * auVar59._8_2_;
                              auVar57._10_2_ = (ushort)((byte)(uVar31 >> 5) & 1) * auVar59._10_2_;
                              auVar57._12_2_ = (ushort)((byte)(uVar31 >> 6) & 1) * auVar59._12_2_;
                              auVar57._14_2_ = (ushort)((byte)(uVar31 >> 7) & 1) * auVar59._14_2_;
                              auVar57._16_2_ = (ushort)(bVar29 & 1) * auVar59._16_2_;
                              auVar57._18_2_ = (ushort)(bVar29 >> 1 & 1) * auVar59._18_2_;
                              auVar57._20_2_ = (ushort)(bVar29 >> 2 & 1) * auVar59._20_2_;
                              auVar57._22_2_ = (ushort)(bVar29 >> 3 & 1) * auVar59._22_2_;
                              auVar57._24_2_ = (ushort)(bVar29 >> 4 & 1) * auVar59._24_2_;
                              auVar57._26_2_ = (ushort)(bVar29 >> 5 & 1) * auVar59._26_2_;
                              auVar57._28_2_ = (ushort)(bVar29 >> 6 & 1) * auVar59._28_2_;
                              auVar57._30_2_ = (ushort)(bVar29 >> 7) * auVar59._30_2_;
                              auVar61 = vpmovzxwd_avx512f(auVar57);
                              auVar61 = vpslld_avx512f(auVar61,0x10);
                              auVar62 = vaddps_avx512f(auVar61,auVar63);
                              auVar62 = vdivps_avx512f(auVar62,auVar64);
                              auVar62 = vmaxps_avx512f(auVar62,ZEXT1664(ZEXT816(0) << 0x40));
                              auVar62 = vminps_avx512f(auVar62,auVar60);
                              auVar61 = vmulps_avx512f(auVar62,auVar61);
                              puVar1 = (uint *)((long)pvVar9 +
                                               uVar52 * 4 +
                                               lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12);
                              bVar15 = (bool)((byte)(uVar31 >> 1) & 1);
                              bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
                              bVar17 = (bool)((byte)(uVar31 >> 3) & 1);
                              bVar18 = (bool)((byte)(uVar31 >> 4) & 1);
                              bVar19 = (bool)((byte)(uVar31 >> 5) & 1);
                              bVar20 = (bool)((byte)(uVar31 >> 6) & 1);
                              bVar21 = (bool)((byte)(uVar31 >> 7) & 1);
                              bVar22 = (bool)(bVar29 >> 1 & 1);
                              bVar23 = (bool)(bVar29 >> 2 & 1);
                              bVar24 = (bool)(bVar29 >> 3 & 1);
                              bVar25 = (bool)(bVar29 >> 4 & 1);
                              bVar26 = (bool)(bVar29 >> 5 & 1);
                              bVar27 = (bool)(bVar29 >> 6 & 1);
                              *puVar1 = (uint)(bVar28 & 1) * auVar61._0_4_ |
                                        (uint)!(bool)(bVar28 & 1) * *puVar1;
                              puVar1[1] = (uint)bVar15 * auVar61._4_4_ | (uint)!bVar15 * puVar1[1];
                              puVar1[2] = (uint)bVar16 * auVar61._8_4_ | (uint)!bVar16 * puVar1[2];
                              puVar1[3] = (uint)bVar17 * auVar61._12_4_ | (uint)!bVar17 * puVar1[3];
                              puVar1[4] = (uint)bVar18 * auVar61._16_4_ | (uint)!bVar18 * puVar1[4];
                              puVar1[5] = (uint)bVar19 * auVar61._20_4_ | (uint)!bVar19 * puVar1[5];
                              puVar1[6] = (uint)bVar20 * auVar61._24_4_ | (uint)!bVar20 * puVar1[6];
                              puVar1[7] = (uint)bVar21 * auVar61._28_4_ | (uint)!bVar21 * puVar1[7];
                              puVar1[8] = (uint)(bVar29 & 1) * auVar61._32_4_ |
                                          (uint)!(bool)(bVar29 & 1) * puVar1[8];
                              puVar1[9] = (uint)bVar22 * auVar61._36_4_ | (uint)!bVar22 * puVar1[9];
                              puVar1[10] = (uint)bVar23 * auVar61._40_4_ |
                                           (uint)!bVar23 * puVar1[10];
                              puVar1[0xb] = (uint)bVar24 * auVar61._44_4_ |
                                            (uint)!bVar24 * puVar1[0xb];
                              puVar1[0xc] = (uint)bVar25 * auVar61._48_4_ |
                                            (uint)!bVar25 * puVar1[0xc];
                              puVar1[0xd] = (uint)bVar26 * auVar61._52_4_ |
                                            (uint)!bVar26 * puVar1[0xd];
                              puVar1[0xe] = (uint)bVar27 * auVar61._56_4_ |
                                            (uint)!bVar27 * puVar1[0xe];
                              puVar1[0xf] = (uint)(bVar29 >> 7) * auVar61._60_4_ |
                                            (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                              uVar52 = uVar52 + 0x10;
                            } while ((lVar36 + 0xfU & 0xfffffffffffffff0) != uVar52);
                          }
                          lVar53 = lVar53 + 1;
                        } while (lVar53 != lVar34);
                        return;
                      }
                      goto LAB_0012e6e5;
                    }
                    goto LAB_0012e6c9;
                  }
                }
                else {
                  if (gVar5 != GGML_TYPE_BF16) goto LAB_0012e170;
                  cVar30 = ggml_is_contiguous_1(pgVar42);
                  if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0'))
                     && (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                    if (pgVar44->nb[0] == 2) {
                      if (pgVar42->nb[0] == 2) {
                        lVar39 = pgVar42->ne[1];
                        lVar35 = pgVar42->ne[2];
                        sVar6 = pgVar42->nb[1];
                        sVar7 = pgVar42->nb[2];
                        sVar8 = pgVar42->nb[3];
                        lVar36 = pgVar44->ne[0];
                        sVar10 = pgVar44->nb[1];
                        sVar11 = pgVar44->nb[2];
                        sVar12 = pgVar44->nb[3];
                        gVar2 = pgVar43->type;
                        iVar3 = *(int *)&pgVar43->field_0x4;
                        lVar33 = ggml_nrows(pgVar42);
                        lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                        lVar53 = (int)gVar2 * lVar34;
                        lVar34 = lVar34 + lVar53;
                        if (lVar33 <= lVar34) {
                          lVar34 = lVar33;
                        }
                        if (lVar34 <= lVar53) {
                          return;
                        }
                        lVar35 = lVar35 * lVar39;
                        pvVar9 = pgVar44->data;
                        pvVar13 = pgVar42->data;
                        do {
                          lVar33 = lVar53 / lVar35;
                          lVar38 = lVar53 % lVar35;
                          lVar55 = lVar38 / lVar39;
                          lVar38 = lVar38 % lVar39;
                          if (0 < lVar36) {
                            lVar40 = 0;
                            do {
                              fVar68 = (float)((uint)*(ushort *)
                                                      ((long)pvVar13 +
                                                      lVar40 * 2 +
                                                      lVar55 * sVar7 +
                                                      lVar38 * sVar6 + lVar33 * sVar8) << 0x10);
                              auVar77._0_4_ = (fVar68 + 3.0) / 6.0;
                              auVar77._4_12_ = SUB6012((undefined1  [60])0x0,0);
                              auVar69 = vmaxss_avx(auVar77,ZEXT816(0) << 0x40);
                              auVar69 = vminss_avx(auVar69,SUB6416(ZEXT464(0x3f800000),0));
                              fVar68 = auVar69._0_4_ * fVar68;
                              if ((uint)ABS(fVar68) < 0x7f800001) {
                                uVar31 = (ushort)((int)fVar68 + 0x7fff + ((uint)fVar68 >> 0x10 & 1)
                                                 >> 0x10);
                              }
                              else {
                                uVar31 = (ushort)((uint)fVar68 >> 0x10) | 0x40;
                              }
                              *(ushort *)
                               ((long)pvVar9 +
                               lVar40 * 2 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                                   uVar31;
                              lVar40 = lVar40 + 1;
                            } while (lVar36 != lVar40);
                          }
                          lVar53 = lVar53 + 1;
                        } while (lVar53 != lVar34);
                        return;
                      }
                      goto LAB_0012e6e5;
                    }
                    goto LAB_0012e6c9;
                  }
                }
              }
              else {
LAB_0012e170:
                if ((gVar2 != GGML_TYPE_F16) || (pgVar44->type != GGML_TYPE_F32)) {
                  pgVar45 = pgVar42;
                  ggml_compute_forward_hardswish_cold_1();
                  pgVar43 = pgVar45->src[0];
                  gVar2 = pgVar43->type;
                  if ((gVar2 == GGML_TYPE_F32) && (pgVar45->type == GGML_TYPE_F32)) {
                    cVar30 = ggml_is_contiguous_1(pgVar43);
                    if (((cVar30 != '\0') &&
                        (cVar30 = ggml_is_contiguous_1(pgVar45), cVar30 != '\0')) &&
                       (cVar30 = ggml_are_same_shape(pgVar43,pgVar45), cVar30 != '\0')) {
                      if (pgVar45->nb[0] != 4) goto LAB_0012ef51;
                      if (pgVar43->nb[0] == 4) {
                        lVar39 = pgVar43->ne[1];
                        lVar35 = pgVar43->ne[2];
                        sVar6 = pgVar43->nb[1];
                        sVar7 = pgVar43->nb[2];
                        sVar8 = pgVar43->nb[3];
                        lVar36 = pgVar45->ne[0];
                        sVar10 = pgVar45->nb[1];
                        sVar11 = pgVar45->nb[2];
                        sVar12 = pgVar45->nb[3];
                        gVar2 = pgVar44->type;
                        iVar3 = *(int *)&pgVar44->field_0x4;
                        lVar33 = ggml_nrows();
                        lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                        lVar53 = (int)gVar2 * lVar34;
                        lVar34 = lVar34 + lVar53;
                        if (lVar33 <= lVar34) {
                          lVar34 = lVar33;
                        }
                        if (lVar34 <= lVar53) {
                          return;
                        }
                        lVar35 = lVar35 * lVar39;
                        pvVar9 = pgVar45->data;
                        pvVar13 = pgVar43->data;
                        do {
                          lVar33 = lVar53 / lVar35;
                          lVar38 = lVar53 % lVar35;
                          lVar55 = lVar38 / lVar39;
                          lVar38 = lVar38 % lVar39;
                          if (0 < lVar36) {
                            lVar40 = 0;
                            do {
                              fVar68 = *(float *)((long)pvVar13 +
                                                 lVar40 * 4 +
                                                 lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8);
                              *(float *)((long)pvVar9 +
                                        lVar40 * 4 +
                                        lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                                   fVar68 * fVar68;
                              lVar40 = lVar40 + 1;
                            } while (lVar36 != lVar40);
                          }
                          lVar53 = lVar53 + 1;
                        } while (lVar53 != lVar34);
                        return;
                      }
LAB_0012ef6d:
                      pcVar37 = "nb00 == sizeof(src0_t)";
                      uVar41 = 0x56;
                      goto LAB_0012ef87;
                    }
                  }
                  else if ((gVar2 == GGML_TYPE_F16) && (pgVar45->type == GGML_TYPE_F16)) {
                    cVar30 = ggml_is_contiguous_1(pgVar43);
                    if (((cVar30 != '\0') &&
                        (cVar30 = ggml_is_contiguous_1(pgVar45), cVar30 != '\0')) &&
                       (cVar30 = ggml_are_same_shape(pgVar43,pgVar45), cVar30 != '\0')) {
                      if (pgVar45->nb[0] == 2) {
                        if (pgVar43->nb[0] == 2) {
                          lVar39 = pgVar43->ne[1];
                          lVar35 = pgVar43->ne[2];
                          sVar6 = pgVar43->nb[1];
                          sVar7 = pgVar43->nb[2];
                          sVar8 = pgVar43->nb[3];
                          lVar36 = pgVar45->ne[0];
                          gVar2 = pgVar44->type;
                          iVar3 = *(int *)&pgVar44->field_0x4;
                          lVar33 = ggml_nrows();
                          lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                          lVar53 = (int)gVar2 * lVar34;
                          lVar34 = lVar34 + lVar53;
                          if (lVar33 <= lVar34) {
                            lVar34 = lVar33;
                          }
                          if (lVar34 <= lVar53) {
                            return;
                          }
                          lVar35 = lVar35 * lVar39;
                          do {
                            lVar33 = lVar53 % lVar35;
                            if (0 < lVar36) {
                              lVar55 = 0;
                              do {
                                auVar69 = vcvtps2ph_f16c(ZEXT416((uint)(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar43->data +
                                                          lVar55 * 2 +
                                                          (lVar33 / lVar39) * sVar7 +
                                                          (lVar33 % lVar39) * sVar6 +
                                                          (lVar53 / lVar35) * sVar8) * 4) *
                                                  *(float *)(&ggml_table_f32_f16 +
                                                            (ulong)*(ushort *)
                                                                    ((long)pgVar43->data +
                                                                    lVar55 * 2 +
                                                                    (lVar33 / lVar39) * sVar7 +
                                                                    (lVar33 % lVar39) * sVar6 +
                                                                    (lVar53 / lVar35) * sVar8) * 4))
                                                  ),0);
                                vpextrw_avx(auVar69,0);
                                lVar55 = lVar55 + 1;
                              } while (lVar36 != lVar55);
                            }
                            lVar53 = lVar53 + 1;
                          } while (lVar53 != lVar34);
                          return;
                        }
                        goto LAB_0012ef6d;
                      }
                      goto LAB_0012ef51;
                    }
                  }
                  else if (gVar2 == GGML_TYPE_BF16) {
                    gVar5 = pgVar45->type;
                    in_RCX = (ulong)gVar5;
                    if (gVar5 == GGML_TYPE_F32) {
                      cVar30 = ggml_is_contiguous_1(pgVar43);
                      if (((cVar30 != '\0') &&
                          (cVar30 = ggml_is_contiguous_1(pgVar45), cVar30 != '\0')) &&
                         (cVar30 = ggml_are_same_shape(pgVar43,pgVar45), cVar30 != '\0')) {
                        if (pgVar45->nb[0] == 4) {
                          if (pgVar43->nb[0] == 2) {
                            lVar39 = pgVar43->ne[1];
                            lVar35 = pgVar43->ne[2];
                            sVar6 = pgVar43->nb[1];
                            sVar7 = pgVar43->nb[2];
                            sVar8 = pgVar43->nb[3];
                            lVar36 = pgVar45->ne[0];
                            sVar10 = pgVar45->nb[1];
                            sVar11 = pgVar45->nb[2];
                            sVar12 = pgVar45->nb[3];
                            gVar2 = pgVar44->type;
                            iVar3 = *(int *)&pgVar44->field_0x4;
                            lVar33 = ggml_nrows(pgVar43);
                            lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                            lVar53 = (int)gVar2 * lVar34;
                            lVar34 = lVar34 + lVar53;
                            if (lVar33 <= lVar34) {
                              lVar34 = lVar33;
                            }
                            if (lVar34 <= lVar53) {
                              return;
                            }
                            lVar35 = lVar35 * lVar39;
                            pvVar9 = pgVar45->data;
                            pvVar13 = pgVar43->data;
                            auVar67 = vpbroadcastq_avx512f();
                            auVar63 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                            auVar64 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                            do {
                              lVar33 = lVar53 / lVar35;
                              lVar38 = lVar53 % lVar35;
                              lVar55 = lVar38 / lVar39;
                              lVar38 = lVar38 % lVar39;
                              if (0 < lVar36) {
                                uVar52 = 0;
                                do {
                                  auVar65 = vpbroadcastq_avx512f();
                                  auVar66 = vporq_avx512f(auVar65,auVar63);
                                  auVar65 = vporq_avx512f(auVar65,auVar64);
                                  uVar41 = vpcmpuq_avx512f(auVar65,auVar67,2);
                                  bVar28 = (byte)uVar41;
                                  uVar41 = vpcmpuq_avx512f(auVar66,auVar67,2);
                                  bVar29 = (byte)uVar41;
                                  uVar31 = CONCAT11(bVar29,bVar28);
                                  auVar59 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                                ((long)pvVar13 +
                                                                uVar52 * 2 +
                                                                lVar55 * sVar7 +
                                                                lVar38 * sVar6 + lVar33 * sVar8));
                                  auVar58._2_2_ = (ushort)((byte)(uVar31 >> 1) & 1) * auVar59._2_2_;
                                  auVar58._0_2_ = (ushort)(bVar28 & 1) * auVar59._0_2_;
                                  auVar58._4_2_ = (ushort)((byte)(uVar31 >> 2) & 1) * auVar59._4_2_;
                                  auVar58._6_2_ = (ushort)((byte)(uVar31 >> 3) & 1) * auVar59._6_2_;
                                  auVar58._8_2_ = (ushort)((byte)(uVar31 >> 4) & 1) * auVar59._8_2_;
                                  auVar58._10_2_ =
                                       (ushort)((byte)(uVar31 >> 5) & 1) * auVar59._10_2_;
                                  auVar58._12_2_ =
                                       (ushort)((byte)(uVar31 >> 6) & 1) * auVar59._12_2_;
                                  auVar58._14_2_ =
                                       (ushort)((byte)(uVar31 >> 7) & 1) * auVar59._14_2_;
                                  auVar58._16_2_ = (ushort)(bVar29 & 1) * auVar59._16_2_;
                                  auVar58._18_2_ = (ushort)(bVar29 >> 1 & 1) * auVar59._18_2_;
                                  auVar58._20_2_ = (ushort)(bVar29 >> 2 & 1) * auVar59._20_2_;
                                  auVar58._22_2_ = (ushort)(bVar29 >> 3 & 1) * auVar59._22_2_;
                                  auVar58._24_2_ = (ushort)(bVar29 >> 4 & 1) * auVar59._24_2_;
                                  auVar58._26_2_ = (ushort)(bVar29 >> 5 & 1) * auVar59._26_2_;
                                  auVar58._28_2_ = (ushort)(bVar29 >> 6 & 1) * auVar59._28_2_;
                                  auVar58._30_2_ = (ushort)(bVar29 >> 7) * auVar59._30_2_;
                                  auVar65 = vpmovzxwd_avx512f(auVar58);
                                  auVar65 = vpslld_avx512f(auVar65,0x10);
                                  auVar65 = vmulps_avx512f(auVar65,auVar65);
                                  puVar1 = (uint *)((long)pvVar9 +
                                                   uVar52 * 4 +
                                                   lVar55 * sVar11 +
                                                   lVar38 * sVar10 + lVar33 * sVar12);
                                  bVar15 = (bool)((byte)(uVar31 >> 1) & 1);
                                  bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
                                  bVar17 = (bool)((byte)(uVar31 >> 3) & 1);
                                  bVar18 = (bool)((byte)(uVar31 >> 4) & 1);
                                  bVar19 = (bool)((byte)(uVar31 >> 5) & 1);
                                  bVar20 = (bool)((byte)(uVar31 >> 6) & 1);
                                  bVar21 = (bool)((byte)(uVar31 >> 7) & 1);
                                  bVar22 = (bool)(bVar29 >> 1 & 1);
                                  bVar23 = (bool)(bVar29 >> 2 & 1);
                                  bVar24 = (bool)(bVar29 >> 3 & 1);
                                  bVar25 = (bool)(bVar29 >> 4 & 1);
                                  bVar26 = (bool)(bVar29 >> 5 & 1);
                                  bVar27 = (bool)(bVar29 >> 6 & 1);
                                  *puVar1 = (uint)(bVar28 & 1) * auVar65._0_4_ |
                                            (uint)!(bool)(bVar28 & 1) * *puVar1;
                                  puVar1[1] = (uint)bVar15 * auVar65._4_4_ |
                                              (uint)!bVar15 * puVar1[1];
                                  puVar1[2] = (uint)bVar16 * auVar65._8_4_ |
                                              (uint)!bVar16 * puVar1[2];
                                  puVar1[3] = (uint)bVar17 * auVar65._12_4_ |
                                              (uint)!bVar17 * puVar1[3];
                                  puVar1[4] = (uint)bVar18 * auVar65._16_4_ |
                                              (uint)!bVar18 * puVar1[4];
                                  puVar1[5] = (uint)bVar19 * auVar65._20_4_ |
                                              (uint)!bVar19 * puVar1[5];
                                  puVar1[6] = (uint)bVar20 * auVar65._24_4_ |
                                              (uint)!bVar20 * puVar1[6];
                                  puVar1[7] = (uint)bVar21 * auVar65._28_4_ |
                                              (uint)!bVar21 * puVar1[7];
                                  puVar1[8] = (uint)(bVar29 & 1) * auVar65._32_4_ |
                                              (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                  puVar1[9] = (uint)bVar22 * auVar65._36_4_ |
                                              (uint)!bVar22 * puVar1[9];
                                  puVar1[10] = (uint)bVar23 * auVar65._40_4_ |
                                               (uint)!bVar23 * puVar1[10];
                                  puVar1[0xb] = (uint)bVar24 * auVar65._44_4_ |
                                                (uint)!bVar24 * puVar1[0xb];
                                  puVar1[0xc] = (uint)bVar25 * auVar65._48_4_ |
                                                (uint)!bVar25 * puVar1[0xc];
                                  puVar1[0xd] = (uint)bVar26 * auVar65._52_4_ |
                                                (uint)!bVar26 * puVar1[0xd];
                                  puVar1[0xe] = (uint)bVar27 * auVar65._56_4_ |
                                                (uint)!bVar27 * puVar1[0xe];
                                  puVar1[0xf] = (uint)(bVar29 >> 7) * auVar65._60_4_ |
                                                (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                                  uVar52 = uVar52 + 0x10;
                                } while ((lVar36 + 0xfU & 0xfffffffffffffff0) != uVar52);
                              }
                              lVar53 = lVar53 + 1;
                            } while (lVar53 != lVar34);
                            return;
                          }
                          goto LAB_0012ef6d;
                        }
                        goto LAB_0012ef51;
                      }
                    }
                    else {
                      if (gVar5 != GGML_TYPE_BF16) goto LAB_0012ea86;
                      cVar30 = ggml_is_contiguous_1(pgVar43);
                      if (((cVar30 != '\0') &&
                          (cVar30 = ggml_is_contiguous_1(pgVar45), cVar30 != '\0')) &&
                         (cVar30 = ggml_are_same_shape(pgVar43,pgVar45), cVar30 != '\0')) {
                        if (pgVar45->nb[0] == 2) {
                          if (pgVar43->nb[0] == 2) {
                            lVar39 = pgVar43->ne[1];
                            lVar35 = pgVar43->ne[2];
                            sVar6 = pgVar43->nb[1];
                            sVar7 = pgVar43->nb[2];
                            sVar8 = pgVar43->nb[3];
                            lVar36 = pgVar45->ne[0];
                            sVar10 = pgVar45->nb[1];
                            sVar11 = pgVar45->nb[2];
                            sVar12 = pgVar45->nb[3];
                            gVar2 = pgVar44->type;
                            iVar3 = *(int *)&pgVar44->field_0x4;
                            lVar33 = ggml_nrows(pgVar43);
                            lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                            lVar53 = (int)gVar2 * lVar34;
                            lVar34 = lVar34 + lVar53;
                            if (lVar33 <= lVar34) {
                              lVar34 = lVar33;
                            }
                            if (lVar34 <= lVar53) {
                              return;
                            }
                            lVar35 = lVar35 * lVar39;
                            pvVar9 = pgVar45->data;
                            pvVar13 = pgVar43->data;
                            do {
                              lVar33 = lVar53 / lVar35;
                              lVar38 = lVar53 % lVar35;
                              lVar55 = lVar38 / lVar39;
                              lVar38 = lVar38 % lVar39;
                              if (0 < lVar36) {
                                lVar40 = 0;
                                do {
                                  fVar68 = (float)((uint)*(ushort *)
                                                          ((long)pvVar13 +
                                                          lVar40 * 2 +
                                                          lVar55 * sVar7 +
                                                          lVar38 * sVar6 + lVar33 * sVar8) << 0x10);
                                  fVar68 = fVar68 * fVar68;
                                  if ((uint)ABS(fVar68) < 0x7f800001) {
                                    uVar31 = (ushort)((int)fVar68 + 0x7fff +
                                                      ((uint)fVar68 >> 0x10 & 1) >> 0x10);
                                  }
                                  else {
                                    uVar31 = (ushort)((uint)fVar68 >> 0x10) | 0x40;
                                  }
                                  *(ushort *)
                                   ((long)pvVar9 +
                                   lVar40 * 2 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12)
                                       = uVar31;
                                  lVar40 = lVar40 + 1;
                                } while (lVar36 != lVar40);
                              }
                              lVar53 = lVar53 + 1;
                            } while (lVar53 != lVar34);
                            return;
                          }
                          goto LAB_0012ef6d;
                        }
                        goto LAB_0012ef51;
                      }
                    }
                  }
                  else {
LAB_0012ea86:
                    if ((gVar2 != GGML_TYPE_F16) || (pgVar45->type != GGML_TYPE_F32)) {
                      pgVar46 = pgVar43;
                      pgVar49 = pgVar45;
                      ggml_compute_forward_sqr_cold_1();
                      pgVar14 = pgVar46->src[0];
                      gVar2 = pgVar14->type;
                      pgStack_290 = pgVar14;
                      pgStack_288 = pgVar46;
                      pgStack_278 = pgVar43;
                      pgStack_270 = pgVar45;
                      if ((gVar2 == GGML_TYPE_F32) && (pgVar46->type == GGML_TYPE_F32)) {
                        pgStack_2d8 = (ggml_tensor *)0x12f515;
                        cVar30 = ggml_is_contiguous_1(pgVar14);
                        if (cVar30 != '\0') {
                          pgStack_2d8 = (ggml_tensor *)0x12f525;
                          cVar30 = ggml_is_contiguous_1(pgVar46);
                          if (cVar30 != '\0') {
                            pgStack_2d8 = (ggml_tensor *)0x12f538;
                            cVar30 = ggml_are_same_shape(pgVar14,pgVar46);
                            if (cVar30 != '\0') {
                              if (pgVar46->nb[0] != 4) goto LAB_0012f851;
                              if (pgVar14->nb[0] == 4) {
                                lStack_2c8 = pgVar14->ne[1];
                                lStack_2d0 = pgVar14->ne[2];
                                sStack_298 = pgVar14->nb[1];
                                sStack_2a0 = pgVar14->nb[2];
                                sStack_2a8 = pgVar14->nb[3];
                                lVar39 = pgVar46->ne[0];
                                sStack_2b0 = pgVar46->nb[1];
                                sStack_2b8 = pgVar46->nb[2];
                                sStack_2c0 = pgVar46->nb[3];
                                gVar2 = pgVar49->type;
                                iVar3 = *(int *)&pgVar49->field_0x4;
                                pgStack_2d8 = (ggml_tensor *)0x12f5b0;
                                lVar36 = ggml_nrows(pgVar14);
                                lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                lVar34 = (int)gVar2 * lVar35;
                                lVar35 = lVar35 + lVar34;
                                if (lVar36 <= lVar35) {
                                  lVar35 = lVar36;
                                }
                                if (lVar35 <= lVar34) {
                                  return;
                                }
                                lStack_2d0 = lStack_2d0 * lStack_2c8;
                                do {
                                  lVar36 = (lVar34 % lStack_2d0) / lStack_2c8;
                                  lVar33 = (lVar34 % lStack_2d0) % lStack_2c8;
                                  if (0 < lVar39) {
                                    lVar55 = (lVar34 / lStack_2d0) * sStack_2c0;
                                    lVar38 = lVar36 * sStack_2b8;
                                    lVar40 = lVar33 * sStack_2b0;
                                    lVar53 = (lVar34 / lStack_2d0) * sStack_2a8;
                                    lVar36 = lVar36 * sStack_2a0;
                                    lVar33 = lVar33 * sStack_298;
                                    pvVar9 = pgStack_288->data;
                                    pvVar13 = pgStack_290->data;
                                    lVar54 = 0;
                                    do {
                                      fVar68 = *(float *)((long)pvVar13 +
                                                         lVar54 * 4 + lVar36 + lVar33 + lVar53);
                                      if (fVar68 < 0.0) {
                                        pgStack_2d8 = (ggml_tensor *)0x12f676;
                                        fVar68 = sqrtf(fVar68);
                                      }
                                      else {
                                        auVar69 = vsqrtss_avx(ZEXT416((uint)fVar68),
                                                              ZEXT416((uint)fVar68));
                                        fVar68 = auVar69._0_4_;
                                      }
                                      *(float *)((long)pvVar9 +
                                                lVar54 * 4 + lVar38 + lVar40 + lVar55) = fVar68;
                                      lVar54 = lVar54 + 1;
                                    } while (lVar39 != lVar54);
                                  }
                                  lVar34 = lVar34 + 1;
                                } while (lVar34 != lVar35);
                                return;
                              }
LAB_0012f86d:
                              pcVar37 = "nb00 == sizeof(src0_t)";
                              uVar41 = 0x56;
                              goto LAB_0012f887;
                            }
                          }
                        }
                      }
                      else if ((gVar2 == GGML_TYPE_F16) && (pgVar46->type == GGML_TYPE_F16)) {
                        pgStack_2d8 = (ggml_tensor *)0x12efe9;
                        cVar30 = ggml_is_contiguous_1(pgVar14);
                        if (cVar30 != '\0') {
                          pgStack_2d8 = (ggml_tensor *)0x12eff9;
                          cVar30 = ggml_is_contiguous_1(pgVar46);
                          if (cVar30 != '\0') {
                            pgStack_2d8 = (ggml_tensor *)0x12f00c;
                            cVar30 = ggml_are_same_shape(pgVar14,pgVar46);
                            if (cVar30 != '\0') {
                              if (pgVar46->nb[0] == 2) {
                                if (pgVar14->nb[0] == 2) {
                                  lStack_2c8 = pgVar14->ne[1];
                                  lStack_2d0 = pgVar14->ne[2];
                                  sStack_2a0 = pgVar14->nb[1];
                                  sStack_2a8 = pgVar14->nb[2];
                                  sStack_2b0 = pgVar14->nb[3];
                                  lVar39 = pgVar46->ne[0];
                                  sStack_2b8 = pgVar46->nb[1];
                                  sStack_2c0 = pgVar46->nb[2];
                                  sStack_280 = pgVar46->nb[3];
                                  gVar2 = pgVar49->type;
                                  iVar3 = *(int *)&pgVar49->field_0x4;
                                  pgStack_2d8 = (ggml_tensor *)0x12f084;
                                  lVar35 = ggml_nrows(pgVar14);
                                  lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3;
                                  lVar34 = (int)gVar2 * lVar36;
                                  sStack_298 = lVar36 + lVar34;
                                  if (lVar35 <= (long)sStack_298) {
                                    sStack_298 = lVar35;
                                  }
                                  if ((long)sStack_298 <= lVar34) {
                                    return;
                                  }
                                  lStack_2d0 = lStack_2d0 * lStack_2c8;
                                  do {
                                    if (0 < lVar39) {
                                      lVar36 = (lVar34 / lStack_2d0) * sStack_2b0;
                                      lVar35 = ((lVar34 % lStack_2d0) / lStack_2c8) * sStack_2a8;
                                      lVar33 = ((lVar34 % lStack_2d0) % lStack_2c8) * sStack_2a0;
                                      pvVar9 = pgStack_290->data;
                                      lVar53 = 0;
                                      do {
                                        fVar68 = *(float *)(&ggml_table_f32_f16 +
                                                           (ulong)*(ushort *)
                                                                   ((long)pvVar9 +
                                                                   lVar53 * 2 +
                                                                   lVar35 + lVar33 + lVar36) * 4);
                                        if (fVar68 < 0.0) {
                                          pgStack_2d8 = (ggml_tensor *)0x12f158;
                                          auVar66._0_4_ = sqrtf(fVar68);
                                          auVar66._4_60_ = extraout_var_00;
                                          auVar69 = auVar66._0_16_;
                                        }
                                        else {
                                          auVar69 = vsqrtss_avx(ZEXT416((uint)fVar68),
                                                                ZEXT416((uint)fVar68));
                                        }
                                        auVar69 = vcvtps2ph_f16c(auVar69,0);
                                        vpextrw_avx(auVar69,0);
                                        lVar53 = lVar53 + 1;
                                      } while (lVar39 != lVar53);
                                    }
                                    lVar34 = lVar34 + 1;
                                  } while (lVar34 != sStack_298);
                                  return;
                                }
                                goto LAB_0012f86d;
                              }
                              goto LAB_0012f851;
                            }
                          }
                        }
                      }
                      else if (gVar2 == GGML_TYPE_BF16) {
                        gVar5 = pgVar46->type;
                        in_RCX = (ulong)gVar5;
                        if (gVar5 == GGML_TYPE_F32) {
                          pgStack_2d8 = (ggml_tensor *)0x12f6a2;
                          cVar30 = ggml_is_contiguous_1(pgVar14);
                          if (cVar30 != '\0') {
                            pgStack_2d8 = (ggml_tensor *)0x12f6b2;
                            cVar30 = ggml_is_contiguous_1(pgVar46);
                            if (cVar30 != '\0') {
                              pgStack_2d8 = (ggml_tensor *)0x12f6c5;
                              cVar30 = ggml_are_same_shape(pgVar14,pgVar46);
                              if (cVar30 != '\0') {
                                if (pgVar46->nb[0] == 4) {
                                  if (pgVar14->nb[0] == 2) {
                                    lStack_2c8 = pgVar14->ne[1];
                                    lStack_2d0 = pgVar14->ne[2];
                                    sStack_298 = pgVar14->nb[1];
                                    sStack_2a0 = pgVar14->nb[2];
                                    sStack_2a8 = pgVar14->nb[3];
                                    lVar39 = pgVar46->ne[0];
                                    sStack_2b0 = pgVar46->nb[1];
                                    sStack_2b8 = pgVar46->nb[2];
                                    sStack_2c0 = pgVar46->nb[3];
                                    gVar2 = pgVar49->type;
                                    iVar3 = *(int *)&pgVar49->field_0x4;
                                    pgStack_2d8 = (ggml_tensor *)0x12f73d;
                                    lVar36 = ggml_nrows(pgVar14);
                                    lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                    lVar34 = (int)gVar2 * lVar35;
                                    lVar35 = lVar35 + lVar34;
                                    if (lVar36 <= lVar35) {
                                      lVar35 = lVar36;
                                    }
                                    if (lVar35 <= lVar34) {
                                      return;
                                    }
                                    lStack_2d0 = lStack_2d0 * lStack_2c8;
                                    do {
                                      lVar36 = (lVar34 % lStack_2d0) / lStack_2c8;
                                      lVar33 = (lVar34 % lStack_2d0) % lStack_2c8;
                                      if (0 < lVar39) {
                                        lVar55 = (lVar34 / lStack_2d0) * sStack_2c0;
                                        lVar40 = lVar36 * sStack_2b8;
                                        lVar54 = lVar33 * sStack_2b0;
                                        lVar53 = (lVar34 / lStack_2d0) * sStack_2a8;
                                        lVar36 = lVar36 * sStack_2a0;
                                        lVar33 = lVar33 * sStack_298;
                                        pvVar9 = pgStack_288->data;
                                        pvVar13 = pgStack_290->data;
                                        lVar38 = 0;
                                        do {
                                          uVar31 = *(ushort *)
                                                    ((long)pvVar13 +
                                                    lVar38 * 2 + lVar36 + lVar33 + lVar53);
                                          fVar68 = (float)((uint)uVar31 << 0x10);
                                          if (fVar68 < 0.0) {
                                            pgStack_2d8 = (ggml_tensor *)0x12f807;
                                            fVar68 = sqrtf(fVar68);
                                          }
                                          else {
                                            auVar69 = ZEXT216(uVar31) << 0x10;
                                            auVar69 = vsqrtss_avx(auVar69,auVar69);
                                            fVar68 = auVar69._0_4_;
                                          }
                                          *(float *)((long)pvVar9 +
                                                    lVar38 * 4 + lVar40 + lVar54 + lVar55) = fVar68;
                                          lVar38 = lVar38 + 1;
                                        } while (lVar39 != lVar38);
                                      }
                                      lVar34 = lVar34 + 1;
                                    } while (lVar34 != lVar35);
                                    return;
                                  }
                                  goto LAB_0012f86d;
                                }
                                goto LAB_0012f851;
                              }
                            }
                          }
                        }
                        else {
                          if (gVar5 != GGML_TYPE_BF16) goto LAB_0012f35e;
                          pgStack_2d8 = (ggml_tensor *)0x12f1a9;
                          cVar30 = ggml_is_contiguous_1(pgVar14);
                          if (cVar30 != '\0') {
                            pgStack_2d8 = (ggml_tensor *)0x12f1b9;
                            cVar30 = ggml_is_contiguous_1(pgVar46);
                            if (cVar30 != '\0') {
                              pgStack_2d8 = (ggml_tensor *)0x12f1cc;
                              cVar30 = ggml_are_same_shape(pgVar14,pgVar46);
                              if (cVar30 != '\0') {
                                if (pgVar46->nb[0] == 2) {
                                  if (pgVar14->nb[0] == 2) {
                                    lStack_2c8 = pgVar14->ne[1];
                                    lStack_2d0 = pgVar14->ne[2];
                                    sStack_298 = pgVar14->nb[1];
                                    sStack_2a0 = pgVar14->nb[2];
                                    sStack_2a8 = pgVar14->nb[3];
                                    lVar39 = pgVar46->ne[0];
                                    sStack_2b0 = pgVar46->nb[1];
                                    sStack_2b8 = pgVar46->nb[2];
                                    sStack_2c0 = pgVar46->nb[3];
                                    gVar2 = pgVar49->type;
                                    iVar3 = *(int *)&pgVar49->field_0x4;
                                    pgStack_2d8 = (ggml_tensor *)0x12f244;
                                    lVar36 = ggml_nrows(pgVar14);
                                    lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                    lVar34 = (int)gVar2 * lVar35;
                                    lVar35 = lVar35 + lVar34;
                                    if (lVar36 <= lVar35) {
                                      lVar35 = lVar36;
                                    }
                                    if (lVar35 <= lVar34) {
                                      return;
                                    }
                                    lStack_2d0 = lStack_2d0 * lStack_2c8;
                                    do {
                                      lVar36 = (lVar34 % lStack_2d0) / lStack_2c8;
                                      lVar33 = (lVar34 % lStack_2d0) % lStack_2c8;
                                      if (0 < lVar39) {
                                        lVar55 = (lVar34 / lStack_2d0) * sStack_2c0;
                                        lVar40 = lVar36 * sStack_2b8;
                                        lVar38 = lVar33 * sStack_2b0;
                                        lVar53 = (lVar34 / lStack_2d0) * sStack_2a8;
                                        lVar36 = lVar36 * sStack_2a0;
                                        lVar33 = lVar33 * sStack_298;
                                        pvVar9 = pgStack_288->data;
                                        pvVar13 = pgStack_290->data;
                                        lVar54 = 0;
                                        do {
                                          uVar31 = *(ushort *)
                                                    ((long)pvVar13 +
                                                    lVar54 * 2 + lVar36 + lVar33 + lVar53);
                                          fVar68 = (float)((uint)uVar31 << 0x10);
                                          if (fVar68 < 0.0) {
                                            pgStack_2d8 = (ggml_tensor *)0x12f311;
                                            fVar68 = sqrtf(fVar68);
                                          }
                                          else {
                                            auVar69 = ZEXT216(uVar31) << 0x10;
                                            auVar69 = vsqrtss_avx(auVar69,auVar69);
                                            fVar68 = auVar69._0_4_;
                                          }
                                          if ((uint)ABS(fVar68) < 0x7f800001) {
                                            uVar31 = (ushort)((int)fVar68 + 0x7fff +
                                                              ((uint)fVar68 >> 0x10 & 1) >> 0x10);
                                          }
                                          else {
                                            uVar31 = (ushort)((uint)fVar68 >> 0x10) | 0x40;
                                          }
                                          *(ushort *)
                                           ((long)pvVar9 + lVar54 * 2 + lVar40 + lVar38 + lVar55) =
                                               uVar31;
                                          lVar54 = lVar54 + 1;
                                        } while (lVar39 != lVar54);
                                      }
                                      lVar34 = lVar34 + 1;
                                    } while (lVar34 != lVar35);
                                    return;
                                  }
                                  goto LAB_0012f86d;
                                }
                                goto LAB_0012f851;
                              }
                            }
                          }
                        }
                      }
                      else {
LAB_0012f35e:
                        if ((gVar2 != GGML_TYPE_F16) || (pgVar46->type != GGML_TYPE_F32)) {
                          pgStack_2d8 = (ggml_tensor *)ggml_compute_forward_sin;
                          pgVar47 = pgVar14;
                          pgVar50 = pgVar46;
                          ggml_compute_forward_sqrt_cold_1();
                          pgVar43 = pgVar47->src[0];
                          gVar2 = pgVar43->type;
                          pgStack_318 = pgVar43;
                          pgStack_310 = pgVar47;
                          pgStack_300 = pgVar46;
                          pgStack_2f8 = pgVar45;
                          pgStack_2f0 = pgVar14;
                          pgStack_2e8 = pgVar42;
                          pgStack_2e0 = pgVar49;
                          pgStack_2d8 = pgVar44;
                          if ((gVar2 == GGML_TYPE_F32) && (pgVar47->type == GGML_TYPE_F32)) {
                            pgStack_360 = (ggml_tensor *)0x12fdd1;
                            cVar30 = ggml_is_contiguous_1(pgVar43);
                            if (cVar30 != '\0') {
                              pgStack_360 = (ggml_tensor *)0x12fde1;
                              cVar30 = ggml_is_contiguous_1(pgVar47);
                              if (cVar30 != '\0') {
                                pgStack_360 = (ggml_tensor *)0x12fdf4;
                                cVar30 = ggml_are_same_shape(pgVar43,pgVar47);
                                if (cVar30 != '\0') {
                                  if (pgVar47->nb[0] != 4) goto LAB_001300dd;
                                  if (pgVar43->nb[0] == 4) {
                                    lStack_350 = pgVar43->ne[1];
                                    lStack_358 = pgVar43->ne[2];
                                    sStack_320 = pgVar43->nb[1];
                                    sStack_328 = pgVar43->nb[2];
                                    sStack_330 = pgVar43->nb[3];
                                    lVar39 = pgVar47->ne[0];
                                    sStack_338 = pgVar47->nb[1];
                                    sStack_340 = pgVar47->nb[2];
                                    sStack_348 = pgVar47->nb[3];
                                    gVar2 = pgVar50->type;
                                    iVar3 = *(int *)&pgVar50->field_0x4;
                                    pgStack_360 = (ggml_tensor *)0x12fe6c;
                                    lVar36 = ggml_nrows(pgVar43);
                                    lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                    lVar34 = (int)gVar2 * lVar35;
                                    lVar35 = lVar35 + lVar34;
                                    if (lVar36 <= lVar35) {
                                      lVar35 = lVar36;
                                    }
                                    if (lVar35 <= lVar34) {
                                      return;
                                    }
                                    lStack_358 = lStack_358 * lStack_350;
                                    do {
                                      lVar36 = (lVar34 % lStack_358) / lStack_350;
                                      lVar33 = (lVar34 % lStack_358) % lStack_350;
                                      if (0 < lVar39) {
                                        lVar55 = (lVar34 / lStack_358) * sStack_348;
                                        lVar38 = lVar36 * sStack_340;
                                        lVar40 = lVar33 * sStack_338;
                                        lVar53 = (lVar34 / lStack_358) * sStack_330;
                                        lVar36 = lVar36 * sStack_328;
                                        lVar33 = lVar33 * sStack_320;
                                        pvVar9 = pgStack_310->data;
                                        pvVar13 = pgStack_318->data;
                                        lVar54 = 0;
                                        do {
                                          pgStack_360 = (ggml_tensor *)0x12ff1e;
                                          fVar68 = sinf(*(float *)((long)pvVar13 +
                                                                  lVar54 * 4 +
                                                                  lVar36 + lVar33 + lVar53));
                                          *(float *)((long)pvVar9 +
                                                    lVar54 * 4 + lVar38 + lVar40 + lVar55) = fVar68;
                                          lVar54 = lVar54 + 1;
                                        } while (lVar39 != lVar54);
                                      }
                                      lVar34 = lVar34 + 1;
                                    } while (lVar34 != lVar35);
                                    return;
                                  }
LAB_001300f9:
                                  pcVar37 = "nb00 == sizeof(src0_t)";
                                  uVar41 = 0x56;
                                  goto LAB_00130113;
                                }
                              }
                            }
                          }
                          else if ((gVar2 == GGML_TYPE_F16) && (pgVar47->type == GGML_TYPE_F16)) {
                            pgStack_360 = (ggml_tensor *)0x12f8e9;
                            cVar30 = ggml_is_contiguous_1(pgVar43);
                            if (cVar30 != '\0') {
                              pgStack_360 = (ggml_tensor *)0x12f8f9;
                              cVar30 = ggml_is_contiguous_1(pgVar47);
                              if (cVar30 != '\0') {
                                pgStack_360 = (ggml_tensor *)0x12f90c;
                                cVar30 = ggml_are_same_shape(pgVar43,pgVar47);
                                if (cVar30 != '\0') {
                                  if (pgVar47->nb[0] == 2) {
                                    if (pgVar43->nb[0] == 2) {
                                      lStack_350 = pgVar43->ne[1];
                                      lStack_358 = pgVar43->ne[2];
                                      sStack_328 = pgVar43->nb[1];
                                      sStack_330 = pgVar43->nb[2];
                                      sStack_338 = pgVar43->nb[3];
                                      lVar39 = pgVar47->ne[0];
                                      sStack_340 = pgVar47->nb[1];
                                      sStack_348 = pgVar47->nb[2];
                                      sStack_308 = pgVar47->nb[3];
                                      gVar2 = pgVar50->type;
                                      iVar3 = *(int *)&pgVar50->field_0x4;
                                      pgStack_360 = (ggml_tensor *)0x12f984;
                                      lVar35 = ggml_nrows(pgVar43);
                                      lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3;
                                      lVar34 = (int)gVar2 * lVar36;
                                      sStack_320 = lVar36 + lVar34;
                                      if (lVar35 <= (long)sStack_320) {
                                        sStack_320 = lVar35;
                                      }
                                      if ((long)sStack_320 <= lVar34) {
                                        return;
                                      }
                                      lStack_358 = lStack_358 * lStack_350;
                                      do {
                                        if (0 < lVar39) {
                                          lVar36 = (lVar34 / lStack_358) * sStack_338;
                                          lVar35 = ((lVar34 % lStack_358) / lStack_350) * sStack_330
                                          ;
                                          lVar33 = ((lVar34 % lStack_358) % lStack_350) * sStack_328
                                          ;
                                          pvVar9 = pgStack_318->data;
                                          lVar53 = 0;
                                          do {
                                            pgStack_360 = (ggml_tensor *)0x12fa44;
                                            auVar65._0_4_ =
                                                 sinf(*(float *)(&ggml_table_f32_f16 +
                                                                (ulong)*(ushort *)
                                                                        ((long)pvVar9 +
                                                                        lVar53 * 2 +
                                                                        lVar35 + lVar33 + lVar36) *
                                                                4));
                                            auVar65._4_60_ = extraout_var_01;
                                            auVar69 = vcvtps2ph_f16c(auVar65._0_16_,0);
                                            vpextrw_avx(auVar69,0);
                                            lVar53 = lVar53 + 1;
                                          } while (lVar39 != lVar53);
                                        }
                                        lVar34 = lVar34 + 1;
                                      } while (lVar34 != sStack_320);
                                      return;
                                    }
                                    goto LAB_001300f9;
                                  }
                                  goto LAB_001300dd;
                                }
                              }
                            }
                          }
                          else if (gVar2 == GGML_TYPE_BF16) {
                            gVar5 = pgVar47->type;
                            in_RCX = (ulong)gVar5;
                            if (gVar5 == GGML_TYPE_F32) {
                              pgStack_360 = (ggml_tensor *)0x12ff46;
                              cVar30 = ggml_is_contiguous_1(pgVar43);
                              if (cVar30 != '\0') {
                                pgStack_360 = (ggml_tensor *)0x12ff56;
                                cVar30 = ggml_is_contiguous_1(pgVar47);
                                if (cVar30 != '\0') {
                                  pgStack_360 = (ggml_tensor *)0x12ff69;
                                  cVar30 = ggml_are_same_shape(pgVar43,pgVar47);
                                  if (cVar30 != '\0') {
                                    if (pgVar47->nb[0] == 4) {
                                      if (pgVar43->nb[0] == 2) {
                                        lStack_350 = pgVar43->ne[1];
                                        lStack_358 = pgVar43->ne[2];
                                        sStack_320 = pgVar43->nb[1];
                                        sStack_328 = pgVar43->nb[2];
                                        sStack_330 = pgVar43->nb[3];
                                        lVar39 = pgVar47->ne[0];
                                        sStack_338 = pgVar47->nb[1];
                                        sStack_340 = pgVar47->nb[2];
                                        sStack_348 = pgVar47->nb[3];
                                        gVar2 = pgVar50->type;
                                        iVar3 = *(int *)&pgVar50->field_0x4;
                                        pgStack_360 = (ggml_tensor *)0x12ffe1;
                                        lVar36 = ggml_nrows(pgVar43);
                                        lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                        lVar34 = (int)gVar2 * lVar35;
                                        lVar35 = lVar35 + lVar34;
                                        if (lVar36 <= lVar35) {
                                          lVar35 = lVar36;
                                        }
                                        if (lVar35 <= lVar34) {
                                          return;
                                        }
                                        lStack_358 = lStack_358 * lStack_350;
                                        do {
                                          lVar36 = (lVar34 % lStack_358) / lStack_350;
                                          lVar33 = (lVar34 % lStack_358) % lStack_350;
                                          if (0 < lVar39) {
                                            lVar55 = (lVar34 / lStack_358) * sStack_348;
                                            lVar40 = lVar36 * sStack_340;
                                            lVar54 = lVar33 * sStack_338;
                                            lVar53 = (lVar34 / lStack_358) * sStack_330;
                                            lVar36 = lVar36 * sStack_328;
                                            lVar33 = lVar33 * sStack_320;
                                            pvVar9 = pgStack_310->data;
                                            pvVar13 = pgStack_318->data;
                                            lVar38 = 0;
                                            do {
                                              pgStack_360 = (ggml_tensor *)0x130097;
                                              fVar68 = sinf((float)((uint)*(ushort *)
                                                                           ((long)pvVar13 +
                                                                           lVar38 * 2 +
                                                                           lVar36 + lVar33 + lVar53)
                                                                   << 0x10));
                                              *(float *)((long)pvVar9 +
                                                        lVar38 * 4 + lVar40 + lVar54 + lVar55) =
                                                   fVar68;
                                              lVar38 = lVar38 + 1;
                                            } while (lVar39 != lVar38);
                                          }
                                          lVar34 = lVar34 + 1;
                                        } while (lVar34 != lVar35);
                                        return;
                                      }
                                      goto LAB_001300f9;
                                    }
                                    goto LAB_001300dd;
                                  }
                                }
                              }
                            }
                            else {
                              if (gVar5 != GGML_TYPE_BF16) goto LAB_0012fc32;
                              pgStack_360 = (ggml_tensor *)0x12fa91;
                              cVar30 = ggml_is_contiguous_1(pgVar43);
                              if (cVar30 != '\0') {
                                pgStack_360 = (ggml_tensor *)0x12faa1;
                                cVar30 = ggml_is_contiguous_1(pgVar47);
                                if (cVar30 != '\0') {
                                  pgStack_360 = (ggml_tensor *)0x12fab4;
                                  cVar30 = ggml_are_same_shape(pgVar43,pgVar47);
                                  if (cVar30 != '\0') {
                                    if (pgVar47->nb[0] == 2) {
                                      if (pgVar43->nb[0] == 2) {
                                        lStack_350 = pgVar43->ne[1];
                                        lStack_358 = pgVar43->ne[2];
                                        sStack_320 = pgVar43->nb[1];
                                        sStack_328 = pgVar43->nb[2];
                                        sStack_330 = pgVar43->nb[3];
                                        lVar39 = pgVar47->ne[0];
                                        sStack_338 = pgVar47->nb[1];
                                        sStack_340 = pgVar47->nb[2];
                                        sStack_348 = pgVar47->nb[3];
                                        gVar2 = pgVar50->type;
                                        iVar3 = *(int *)&pgVar50->field_0x4;
                                        pgStack_360 = (ggml_tensor *)0x12fb2c;
                                        lVar36 = ggml_nrows(pgVar43);
                                        lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                        lVar34 = (int)gVar2 * lVar35;
                                        lVar35 = lVar35 + lVar34;
                                        if (lVar36 <= lVar35) {
                                          lVar35 = lVar36;
                                        }
                                        if (lVar35 <= lVar34) {
                                          return;
                                        }
                                        lStack_358 = lStack_358 * lStack_350;
                                        do {
                                          lVar36 = (lVar34 % lStack_358) / lStack_350;
                                          lVar33 = (lVar34 % lStack_358) % lStack_350;
                                          if (0 < lVar39) {
                                            lVar55 = (lVar34 / lStack_358) * sStack_348;
                                            lVar40 = lVar36 * sStack_340;
                                            lVar38 = lVar33 * sStack_338;
                                            lVar53 = (lVar34 / lStack_358) * sStack_330;
                                            lVar36 = lVar36 * sStack_328;
                                            lVar33 = lVar33 * sStack_320;
                                            pvVar9 = pgStack_310->data;
                                            pvVar13 = pgStack_318->data;
                                            lVar54 = 0;
                                            do {
                                              pgStack_360 = (ggml_tensor *)0x12fbe9;
                                              fVar68 = sinf((float)((uint)*(ushort *)
                                                                           ((long)pvVar13 +
                                                                           lVar54 * 2 +
                                                                           lVar36 + lVar33 + lVar53)
                                                                   << 0x10));
                                              if ((uint)ABS(fVar68) < 0x7f800001) {
                                                uVar31 = (ushort)((int)fVar68 + 0x7fff +
                                                                  ((uint)fVar68 >> 0x10 & 1) >> 0x10
                                                                 );
                                              }
                                              else {
                                                uVar31 = (ushort)((uint)fVar68 >> 0x10) | 0x40;
                                              }
                                              *(ushort *)
                                               ((long)pvVar9 + lVar54 * 2 + lVar40 + lVar38 + lVar55
                                               ) = uVar31;
                                              lVar54 = lVar54 + 1;
                                            } while (lVar39 != lVar54);
                                          }
                                          lVar34 = lVar34 + 1;
                                        } while (lVar34 != lVar35);
                                        return;
                                      }
                                      goto LAB_001300f9;
                                    }
                                    goto LAB_001300dd;
                                  }
                                }
                              }
                            }
                          }
                          else {
LAB_0012fc32:
                            if ((gVar2 != GGML_TYPE_F16) || (pgVar47->type != GGML_TYPE_F32)) {
                              pgStack_360 = (ggml_tensor *)ggml_compute_forward_cos;
                              pgVar46 = pgVar43;
                              pgVar49 = pgVar47;
                              ggml_compute_forward_sin_cold_1();
                              pgVar14 = pgVar46->src[0];
                              gVar2 = pgVar14->type;
                              pgStack_3a0 = pgVar14;
                              pgStack_398 = pgVar46;
                              pgStack_388 = pgVar47;
                              pgStack_380 = pgVar45;
                              pgStack_378 = pgVar43;
                              pgStack_370 = pgVar42;
                              pgStack_368 = pgVar50;
                              pgStack_360 = pgVar44;
                              if ((gVar2 == GGML_TYPE_F32) && (pgVar46->type == GGML_TYPE_F32)) {
                                pgStack_3e8 = (ggml_tensor *)0x13065d;
                                cVar30 = ggml_is_contiguous_1(pgVar14);
                                if (cVar30 != '\0') {
                                  pgStack_3e8 = (ggml_tensor *)0x13066d;
                                  cVar30 = ggml_is_contiguous_1(pgVar46);
                                  if (cVar30 != '\0') {
                                    pgStack_3e8 = (ggml_tensor *)0x130680;
                                    cVar30 = ggml_are_same_shape(pgVar14,pgVar46);
                                    if (cVar30 != '\0') {
                                      if (pgVar46->nb[0] != 4) goto LAB_00130969;
                                      if (pgVar14->nb[0] == 4) {
                                        lStack_3d8 = pgVar14->ne[1];
                                        lStack_3e0 = pgVar14->ne[2];
                                        sStack_3a8 = pgVar14->nb[1];
                                        sStack_3b0 = pgVar14->nb[2];
                                        sStack_3b8 = pgVar14->nb[3];
                                        lVar39 = pgVar46->ne[0];
                                        sStack_3c0 = pgVar46->nb[1];
                                        sStack_3c8 = pgVar46->nb[2];
                                        sStack_3d0 = pgVar46->nb[3];
                                        gVar2 = pgVar49->type;
                                        iVar3 = *(int *)&pgVar49->field_0x4;
                                        pgStack_3e8 = (ggml_tensor *)0x1306f8;
                                        lVar36 = ggml_nrows(pgVar14);
                                        lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                        lVar34 = (int)gVar2 * lVar35;
                                        lVar35 = lVar35 + lVar34;
                                        if (lVar36 <= lVar35) {
                                          lVar35 = lVar36;
                                        }
                                        if (lVar35 <= lVar34) {
                                          return;
                                        }
                                        lStack_3e0 = lStack_3e0 * lStack_3d8;
                                        do {
                                          lVar36 = (lVar34 % lStack_3e0) / lStack_3d8;
                                          lVar33 = (lVar34 % lStack_3e0) % lStack_3d8;
                                          if (0 < lVar39) {
                                            lVar55 = (lVar34 / lStack_3e0) * sStack_3d0;
                                            lVar38 = lVar36 * sStack_3c8;
                                            lVar40 = lVar33 * sStack_3c0;
                                            lVar53 = (lVar34 / lStack_3e0) * sStack_3b8;
                                            lVar36 = lVar36 * sStack_3b0;
                                            lVar33 = lVar33 * sStack_3a8;
                                            pvVar9 = pgStack_398->data;
                                            pvVar13 = pgStack_3a0->data;
                                            lVar54 = 0;
                                            do {
                                              pgStack_3e8 = (ggml_tensor *)0x1307aa;
                                              fVar68 = cosf(*(float *)((long)pvVar13 +
                                                                      lVar54 * 4 +
                                                                      lVar36 + lVar33 + lVar53));
                                              *(float *)((long)pvVar9 +
                                                        lVar54 * 4 + lVar38 + lVar40 + lVar55) =
                                                   fVar68;
                                              lVar54 = lVar54 + 1;
                                            } while (lVar39 != lVar54);
                                          }
                                          lVar34 = lVar34 + 1;
                                        } while (lVar34 != lVar35);
                                        return;
                                      }
LAB_00130985:
                                      pcVar37 = "nb00 == sizeof(src0_t)";
                                      uVar41 = 0x56;
                                      goto LAB_0013099f;
                                    }
                                  }
                                }
                              }
                              else if ((gVar2 == GGML_TYPE_F16) && (pgVar46->type == GGML_TYPE_F16))
                              {
                                pgStack_3e8 = (ggml_tensor *)0x130175;
                                cVar30 = ggml_is_contiguous_1(pgVar14);
                                if (cVar30 != '\0') {
                                  pgStack_3e8 = (ggml_tensor *)0x130185;
                                  cVar30 = ggml_is_contiguous_1(pgVar46);
                                  if (cVar30 != '\0') {
                                    pgStack_3e8 = (ggml_tensor *)0x130198;
                                    cVar30 = ggml_are_same_shape(pgVar14,pgVar46);
                                    if (cVar30 != '\0') {
                                      if (pgVar46->nb[0] == 2) {
                                        if (pgVar14->nb[0] == 2) {
                                          lStack_3d8 = pgVar14->ne[1];
                                          lStack_3e0 = pgVar14->ne[2];
                                          sStack_3b0 = pgVar14->nb[1];
                                          sStack_3b8 = pgVar14->nb[2];
                                          sStack_3c0 = pgVar14->nb[3];
                                          lVar39 = pgVar46->ne[0];
                                          sStack_3c8 = pgVar46->nb[1];
                                          sStack_3d0 = pgVar46->nb[2];
                                          sStack_390 = pgVar46->nb[3];
                                          gVar2 = pgVar49->type;
                                          iVar3 = *(int *)&pgVar49->field_0x4;
                                          pgStack_3e8 = (ggml_tensor *)0x130210;
                                          lVar35 = ggml_nrows(pgVar14);
                                          lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3;
                                          lVar34 = (int)gVar2 * lVar36;
                                          sStack_3a8 = lVar36 + lVar34;
                                          if (lVar35 <= (long)sStack_3a8) {
                                            sStack_3a8 = lVar35;
                                          }
                                          if ((long)sStack_3a8 <= lVar34) {
                                            return;
                                          }
                                          lStack_3e0 = lStack_3e0 * lStack_3d8;
                                          do {
                                            if (0 < lVar39) {
                                              lVar36 = (lVar34 / lStack_3e0) * sStack_3c0;
                                              lVar35 = ((lVar34 % lStack_3e0) / lStack_3d8) *
                                                       sStack_3b8;
                                              lVar33 = ((lVar34 % lStack_3e0) % lStack_3d8) *
                                                       sStack_3b0;
                                              pvVar9 = pgStack_3a0->data;
                                              lVar53 = 0;
                                              do {
                                                pgStack_3e8 = (ggml_tensor *)0x1302d0;
                                                auVar64._0_4_ =
                                                     cosf(*(float *)(&ggml_table_f32_f16 +
                                                                    (ulong)*(ushort *)
                                                                            ((long)pvVar9 +
                                                                            lVar53 * 2 +
                                                                            lVar35 + lVar33 + lVar36
                                                                            ) * 4));
                                                auVar64._4_60_ = extraout_var_02;
                                                auVar69 = vcvtps2ph_f16c(auVar64._0_16_,0);
                                                vpextrw_avx(auVar69,0);
                                                lVar53 = lVar53 + 1;
                                              } while (lVar39 != lVar53);
                                            }
                                            lVar34 = lVar34 + 1;
                                          } while (lVar34 != sStack_3a8);
                                          return;
                                        }
                                        goto LAB_00130985;
                                      }
                                      goto LAB_00130969;
                                    }
                                  }
                                }
                              }
                              else if (gVar2 == GGML_TYPE_BF16) {
                                gVar5 = pgVar46->type;
                                in_RCX = (ulong)gVar5;
                                if (gVar5 == GGML_TYPE_F32) {
                                  pgStack_3e8 = (ggml_tensor *)0x1307d2;
                                  cVar30 = ggml_is_contiguous_1(pgVar14);
                                  if (cVar30 != '\0') {
                                    pgStack_3e8 = (ggml_tensor *)0x1307e2;
                                    cVar30 = ggml_is_contiguous_1(pgVar46);
                                    if (cVar30 != '\0') {
                                      pgStack_3e8 = (ggml_tensor *)0x1307f5;
                                      cVar30 = ggml_are_same_shape(pgVar14,pgVar46);
                                      if (cVar30 != '\0') {
                                        if (pgVar46->nb[0] == 4) {
                                          if (pgVar14->nb[0] == 2) {
                                            lStack_3d8 = pgVar14->ne[1];
                                            lStack_3e0 = pgVar14->ne[2];
                                            sStack_3a8 = pgVar14->nb[1];
                                            sStack_3b0 = pgVar14->nb[2];
                                            sStack_3b8 = pgVar14->nb[3];
                                            lVar39 = pgVar46->ne[0];
                                            sStack_3c0 = pgVar46->nb[1];
                                            sStack_3c8 = pgVar46->nb[2];
                                            sStack_3d0 = pgVar46->nb[3];
                                            gVar2 = pgVar49->type;
                                            iVar3 = *(int *)&pgVar49->field_0x4;
                                            pgStack_3e8 = (ggml_tensor *)0x13086d;
                                            lVar36 = ggml_nrows(pgVar14);
                                            lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                            lVar34 = (int)gVar2 * lVar35;
                                            lVar35 = lVar35 + lVar34;
                                            if (lVar36 <= lVar35) {
                                              lVar35 = lVar36;
                                            }
                                            if (lVar35 <= lVar34) {
                                              return;
                                            }
                                            lStack_3e0 = lStack_3e0 * lStack_3d8;
                                            do {
                                              lVar36 = (lVar34 % lStack_3e0) / lStack_3d8;
                                              lVar33 = (lVar34 % lStack_3e0) % lStack_3d8;
                                              if (0 < lVar39) {
                                                lVar55 = (lVar34 / lStack_3e0) * sStack_3d0;
                                                lVar40 = lVar36 * sStack_3c8;
                                                lVar54 = lVar33 * sStack_3c0;
                                                lVar53 = (lVar34 / lStack_3e0) * sStack_3b8;
                                                lVar36 = lVar36 * sStack_3b0;
                                                lVar33 = lVar33 * sStack_3a8;
                                                pvVar9 = pgStack_398->data;
                                                pvVar13 = pgStack_3a0->data;
                                                lVar38 = 0;
                                                do {
                                                  pgStack_3e8 = (ggml_tensor *)0x130923;
                                                  fVar68 = cosf((float)((uint)*(ushort *)
                                                                               ((long)pvVar13 +
                                                                               lVar38 * 2 +
                                                                               lVar36 + lVar33 + 
                                                  lVar53) << 0x10));
                                                  *(float *)((long)pvVar9 +
                                                            lVar38 * 4 + lVar40 + lVar54 + lVar55) =
                                                       fVar68;
                                                  lVar38 = lVar38 + 1;
                                                } while (lVar39 != lVar38);
                                              }
                                              lVar34 = lVar34 + 1;
                                            } while (lVar34 != lVar35);
                                            return;
                                          }
                                          goto LAB_00130985;
                                        }
                                        goto LAB_00130969;
                                      }
                                    }
                                  }
                                }
                                else {
                                  if (gVar5 != GGML_TYPE_BF16) goto LAB_001304be;
                                  pgStack_3e8 = (ggml_tensor *)0x13031d;
                                  cVar30 = ggml_is_contiguous_1(pgVar14);
                                  if (cVar30 != '\0') {
                                    pgStack_3e8 = (ggml_tensor *)0x13032d;
                                    cVar30 = ggml_is_contiguous_1(pgVar46);
                                    if (cVar30 != '\0') {
                                      pgStack_3e8 = (ggml_tensor *)0x130340;
                                      cVar30 = ggml_are_same_shape(pgVar14,pgVar46);
                                      if (cVar30 != '\0') {
                                        if (pgVar46->nb[0] == 2) {
                                          if (pgVar14->nb[0] == 2) {
                                            lStack_3d8 = pgVar14->ne[1];
                                            lStack_3e0 = pgVar14->ne[2];
                                            sStack_3a8 = pgVar14->nb[1];
                                            sStack_3b0 = pgVar14->nb[2];
                                            sStack_3b8 = pgVar14->nb[3];
                                            lVar39 = pgVar46->ne[0];
                                            sStack_3c0 = pgVar46->nb[1];
                                            sStack_3c8 = pgVar46->nb[2];
                                            sStack_3d0 = pgVar46->nb[3];
                                            gVar2 = pgVar49->type;
                                            iVar3 = *(int *)&pgVar49->field_0x4;
                                            pgStack_3e8 = (ggml_tensor *)0x1303b8;
                                            lVar36 = ggml_nrows(pgVar14);
                                            lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                            lVar34 = (int)gVar2 * lVar35;
                                            lVar35 = lVar35 + lVar34;
                                            if (lVar36 <= lVar35) {
                                              lVar35 = lVar36;
                                            }
                                            if (lVar35 <= lVar34) {
                                              return;
                                            }
                                            lStack_3e0 = lStack_3e0 * lStack_3d8;
                                            do {
                                              lVar36 = (lVar34 % lStack_3e0) / lStack_3d8;
                                              lVar33 = (lVar34 % lStack_3e0) % lStack_3d8;
                                              if (0 < lVar39) {
                                                lVar55 = (lVar34 / lStack_3e0) * sStack_3d0;
                                                lVar40 = lVar36 * sStack_3c8;
                                                lVar38 = lVar33 * sStack_3c0;
                                                lVar53 = (lVar34 / lStack_3e0) * sStack_3b8;
                                                lVar36 = lVar36 * sStack_3b0;
                                                lVar33 = lVar33 * sStack_3a8;
                                                pvVar9 = pgStack_398->data;
                                                pvVar13 = pgStack_3a0->data;
                                                lVar54 = 0;
                                                do {
                                                  pgStack_3e8 = (ggml_tensor *)0x130475;
                                                  fVar68 = cosf((float)((uint)*(ushort *)
                                                                               ((long)pvVar13 +
                                                                               lVar54 * 2 +
                                                                               lVar36 + lVar33 + 
                                                  lVar53) << 0x10));
                                                  if ((uint)ABS(fVar68) < 0x7f800001) {
                                                    uVar31 = (ushort)((int)fVar68 + 0x7fff +
                                                                      ((uint)fVar68 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar31 = (ushort)((uint)fVar68 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar9 +
                                                   lVar54 * 2 + lVar40 + lVar38 + lVar55) = uVar31;
                                                  lVar54 = lVar54 + 1;
                                                } while (lVar39 != lVar54);
                                              }
                                              lVar34 = lVar34 + 1;
                                            } while (lVar34 != lVar35);
                                            return;
                                          }
                                          goto LAB_00130985;
                                        }
                                        goto LAB_00130969;
                                      }
                                    }
                                  }
                                }
                              }
                              else {
LAB_001304be:
                                if ((gVar2 != GGML_TYPE_F16) || (pgVar46->type != GGML_TYPE_F32)) {
                                  pgStack_3e8 = (ggml_tensor *)ggml_compute_forward_log;
                                  pgVar47 = pgVar14;
                                  pgVar50 = pgVar46;
                                  ggml_compute_forward_cos_cold_1();
                                  pgVar43 = pgVar47->src[0];
                                  gVar2 = pgVar43->type;
                                  pgStack_428 = pgVar43;
                                  pgStack_420 = pgVar47;
                                  pgStack_410 = pgVar46;
                                  pgStack_408 = pgVar45;
                                  pgStack_400 = pgVar14;
                                  pgStack_3f8 = pgVar42;
                                  pgStack_3f0 = pgVar49;
                                  pgStack_3e8 = pgVar44;
                                  if ((gVar2 == GGML_TYPE_F32) && (pgVar47->type == GGML_TYPE_F32))
                                  {
                                    pgStack_470 = (ggml_tensor *)0x130ee9;
                                    cVar30 = ggml_is_contiguous_1(pgVar43);
                                    if (cVar30 != '\0') {
                                      pgStack_470 = (ggml_tensor *)0x130ef9;
                                      cVar30 = ggml_is_contiguous_1(pgVar47);
                                      if (cVar30 != '\0') {
                                        pgStack_470 = (ggml_tensor *)0x130f0c;
                                        cVar30 = ggml_are_same_shape(pgVar43,pgVar47);
                                        if (cVar30 != '\0') {
                                          if (pgVar47->nb[0] != 4) goto LAB_001311f5;
                                          if (pgVar43->nb[0] == 4) {
                                            lStack_460 = pgVar43->ne[1];
                                            lStack_468 = pgVar43->ne[2];
                                            sStack_430 = pgVar43->nb[1];
                                            sStack_438 = pgVar43->nb[2];
                                            sStack_440 = pgVar43->nb[3];
                                            lVar39 = pgVar47->ne[0];
                                            sStack_448 = pgVar47->nb[1];
                                            sStack_450 = pgVar47->nb[2];
                                            sStack_458 = pgVar47->nb[3];
                                            gVar2 = pgVar50->type;
                                            iVar3 = *(int *)&pgVar50->field_0x4;
                                            pgStack_470 = (ggml_tensor *)0x130f84;
                                            lVar36 = ggml_nrows(pgVar43);
                                            lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                            lVar34 = (int)gVar2 * lVar35;
                                            lVar35 = lVar35 + lVar34;
                                            if (lVar36 <= lVar35) {
                                              lVar35 = lVar36;
                                            }
                                            if (lVar35 <= lVar34) {
                                              return;
                                            }
                                            lStack_468 = lStack_468 * lStack_460;
                                            do {
                                              lVar36 = (lVar34 % lStack_468) / lStack_460;
                                              lVar33 = (lVar34 % lStack_468) % lStack_460;
                                              if (0 < lVar39) {
                                                lVar55 = (lVar34 / lStack_468) * sStack_458;
                                                lVar38 = lVar36 * sStack_450;
                                                lVar40 = lVar33 * sStack_448;
                                                lVar53 = (lVar34 / lStack_468) * sStack_440;
                                                lVar36 = lVar36 * sStack_438;
                                                lVar33 = lVar33 * sStack_430;
                                                pvVar9 = pgStack_420->data;
                                                pvVar13 = pgStack_428->data;
                                                lVar54 = 0;
                                                do {
                                                  pgStack_470 = (ggml_tensor *)0x131036;
                                                  fVar68 = logf(*(float *)((long)pvVar13 +
                                                                          lVar54 * 4 +
                                                                          lVar36 + lVar33 + lVar53))
                                                  ;
                                                  *(float *)((long)pvVar9 +
                                                            lVar54 * 4 + lVar38 + lVar40 + lVar55) =
                                                       fVar68;
                                                  lVar54 = lVar54 + 1;
                                                } while (lVar39 != lVar54);
                                              }
                                              lVar34 = lVar34 + 1;
                                            } while (lVar34 != lVar35);
                                            return;
                                          }
LAB_00131211:
                                          pcVar37 = "nb00 == sizeof(src0_t)";
                                          uVar41 = 0x56;
                                          goto LAB_0013122b;
                                        }
                                      }
                                    }
                                  }
                                  else if ((gVar2 == GGML_TYPE_F16) &&
                                          (pgVar47->type == GGML_TYPE_F16)) {
                                    pgStack_470 = (ggml_tensor *)0x130a01;
                                    cVar30 = ggml_is_contiguous_1(pgVar43);
                                    if (cVar30 != '\0') {
                                      pgStack_470 = (ggml_tensor *)0x130a11;
                                      cVar30 = ggml_is_contiguous_1(pgVar47);
                                      if (cVar30 != '\0') {
                                        pgStack_470 = (ggml_tensor *)0x130a24;
                                        cVar30 = ggml_are_same_shape(pgVar43,pgVar47);
                                        if (cVar30 != '\0') {
                                          if (pgVar47->nb[0] == 2) {
                                            if (pgVar43->nb[0] == 2) {
                                              lStack_460 = pgVar43->ne[1];
                                              lStack_468 = pgVar43->ne[2];
                                              sStack_438 = pgVar43->nb[1];
                                              sStack_440 = pgVar43->nb[2];
                                              sStack_448 = pgVar43->nb[3];
                                              lVar39 = pgVar47->ne[0];
                                              sStack_450 = pgVar47->nb[1];
                                              sStack_458 = pgVar47->nb[2];
                                              sStack_418 = pgVar47->nb[3];
                                              gVar2 = pgVar50->type;
                                              iVar3 = *(int *)&pgVar50->field_0x4;
                                              pgStack_470 = (ggml_tensor *)0x130a9c;
                                              lVar35 = ggml_nrows(pgVar43);
                                              lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3;
                                              lVar34 = (int)gVar2 * lVar36;
                                              sStack_430 = lVar36 + lVar34;
                                              if (lVar35 <= (long)sStack_430) {
                                                sStack_430 = lVar35;
                                              }
                                              if ((long)sStack_430 <= lVar34) {
                                                return;
                                              }
                                              lStack_468 = lStack_468 * lStack_460;
                                              do {
                                                if (0 < lVar39) {
                                                  lVar36 = (lVar34 / lStack_468) * sStack_448;
                                                  lVar35 = ((lVar34 % lStack_468) / lStack_460) *
                                                           sStack_440;
                                                  lVar33 = ((lVar34 % lStack_468) % lStack_460) *
                                                           sStack_438;
                                                  pvVar9 = pgStack_428->data;
                                                  lVar53 = 0;
                                                  do {
                                                    pgStack_470 = (ggml_tensor *)0x130b5c;
                                                    auVar63._0_4_ =
                                                         logf(*(float *)(&ggml_table_f32_f16 +
                                                                        (ulong)*(ushort *)
                                                                                ((long)pvVar9 +
                                                                                lVar53 * 2 +
                                                                                lVar35 + lVar33 + 
                                                  lVar36) * 4));
                                                  auVar63._4_60_ = extraout_var_03;
                                                  auVar69 = vcvtps2ph_f16c(auVar63._0_16_,0);
                                                  vpextrw_avx(auVar69,0);
                                                  lVar53 = lVar53 + 1;
                                                  } while (lVar39 != lVar53);
                                                }
                                                lVar34 = lVar34 + 1;
                                              } while (lVar34 != sStack_430);
                                              return;
                                            }
                                            goto LAB_00131211;
                                          }
                                          goto LAB_001311f5;
                                        }
                                      }
                                    }
                                  }
                                  else if (gVar2 == GGML_TYPE_BF16) {
                                    gVar5 = pgVar47->type;
                                    in_RCX = (ulong)gVar5;
                                    if (gVar5 == GGML_TYPE_F32) {
                                      pgStack_470 = (ggml_tensor *)0x13105e;
                                      cVar30 = ggml_is_contiguous_1(pgVar43);
                                      if (cVar30 != '\0') {
                                        pgStack_470 = (ggml_tensor *)0x13106e;
                                        cVar30 = ggml_is_contiguous_1(pgVar47);
                                        if (cVar30 != '\0') {
                                          pgStack_470 = (ggml_tensor *)0x131081;
                                          cVar30 = ggml_are_same_shape(pgVar43,pgVar47);
                                          if (cVar30 != '\0') {
                                            if (pgVar47->nb[0] == 4) {
                                              if (pgVar43->nb[0] == 2) {
                                                lStack_460 = pgVar43->ne[1];
                                                lStack_468 = pgVar43->ne[2];
                                                sStack_430 = pgVar43->nb[1];
                                                sStack_438 = pgVar43->nb[2];
                                                sStack_440 = pgVar43->nb[3];
                                                lVar39 = pgVar47->ne[0];
                                                sStack_448 = pgVar47->nb[1];
                                                sStack_450 = pgVar47->nb[2];
                                                sStack_458 = pgVar47->nb[3];
                                                gVar2 = pgVar50->type;
                                                iVar3 = *(int *)&pgVar50->field_0x4;
                                                pgStack_470 = (ggml_tensor *)0x1310f9;
                                                lVar36 = ggml_nrows(pgVar43);
                                                lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                                lVar34 = (int)gVar2 * lVar35;
                                                lVar35 = lVar35 + lVar34;
                                                if (lVar36 <= lVar35) {
                                                  lVar35 = lVar36;
                                                }
                                                if (lVar35 <= lVar34) {
                                                  return;
                                                }
                                                lStack_468 = lStack_468 * lStack_460;
                                                do {
                                                  lVar36 = (lVar34 % lStack_468) / lStack_460;
                                                  lVar33 = (lVar34 % lStack_468) % lStack_460;
                                                  if (0 < lVar39) {
                                                    lVar55 = (lVar34 / lStack_468) * sStack_458;
                                                    lVar40 = lVar36 * sStack_450;
                                                    lVar54 = lVar33 * sStack_448;
                                                    lVar53 = (lVar34 / lStack_468) * sStack_440;
                                                    lVar36 = lVar36 * sStack_438;
                                                    lVar33 = lVar33 * sStack_430;
                                                    pvVar9 = pgStack_420->data;
                                                    pvVar13 = pgStack_428->data;
                                                    lVar38 = 0;
                                                    do {
                                                      pgStack_470 = (ggml_tensor *)0x1311af;
                                                      fVar68 = logf((float)((uint)*(ushort *)
                                                                                   ((long)pvVar13 +
                                                                                   lVar38 * 2 +
                                                                                   lVar36 + lVar33 +
                                                                                            lVar53)
                                                                           << 0x10));
                                                      *(float *)((long)pvVar9 +
                                                                lVar38 * 4 +
                                                                lVar40 + lVar54 + lVar55) = fVar68;
                                                      lVar38 = lVar38 + 1;
                                                    } while (lVar39 != lVar38);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                } while (lVar34 != lVar35);
                                                return;
                                              }
                                              goto LAB_00131211;
                                            }
                                            goto LAB_001311f5;
                                          }
                                        }
                                      }
                                    }
                                    else {
                                      if (gVar5 != GGML_TYPE_BF16) goto LAB_00130d4a;
                                      pgStack_470 = (ggml_tensor *)0x130ba9;
                                      cVar30 = ggml_is_contiguous_1(pgVar43);
                                      if (cVar30 != '\0') {
                                        pgStack_470 = (ggml_tensor *)0x130bb9;
                                        cVar30 = ggml_is_contiguous_1(pgVar47);
                                        if (cVar30 != '\0') {
                                          pgStack_470 = (ggml_tensor *)0x130bcc;
                                          cVar30 = ggml_are_same_shape(pgVar43,pgVar47);
                                          if (cVar30 != '\0') {
                                            if (pgVar47->nb[0] == 2) {
                                              if (pgVar43->nb[0] == 2) {
                                                lStack_460 = pgVar43->ne[1];
                                                lStack_468 = pgVar43->ne[2];
                                                sStack_430 = pgVar43->nb[1];
                                                sStack_438 = pgVar43->nb[2];
                                                sStack_440 = pgVar43->nb[3];
                                                lVar39 = pgVar47->ne[0];
                                                sStack_448 = pgVar47->nb[1];
                                                sStack_450 = pgVar47->nb[2];
                                                sStack_458 = pgVar47->nb[3];
                                                gVar2 = pgVar50->type;
                                                iVar3 = *(int *)&pgVar50->field_0x4;
                                                pgStack_470 = (ggml_tensor *)0x130c44;
                                                lVar36 = ggml_nrows(pgVar43);
                                                lVar35 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                                lVar34 = (int)gVar2 * lVar35;
                                                lVar35 = lVar35 + lVar34;
                                                if (lVar36 <= lVar35) {
                                                  lVar35 = lVar36;
                                                }
                                                if (lVar35 <= lVar34) {
                                                  return;
                                                }
                                                lStack_468 = lStack_468 * lStack_460;
                                                do {
                                                  lVar36 = (lVar34 % lStack_468) / lStack_460;
                                                  lVar33 = (lVar34 % lStack_468) % lStack_460;
                                                  if (0 < lVar39) {
                                                    lVar55 = (lVar34 / lStack_468) * sStack_458;
                                                    lVar40 = lVar36 * sStack_450;
                                                    lVar38 = lVar33 * sStack_448;
                                                    lVar53 = (lVar34 / lStack_468) * sStack_440;
                                                    lVar36 = lVar36 * sStack_438;
                                                    lVar33 = lVar33 * sStack_430;
                                                    pvVar9 = pgStack_420->data;
                                                    pvVar13 = pgStack_428->data;
                                                    lVar54 = 0;
                                                    do {
                                                      pgStack_470 = (ggml_tensor *)0x130d01;
                                                      fVar68 = logf((float)((uint)*(ushort *)
                                                                                   ((long)pvVar13 +
                                                                                   lVar54 * 2 +
                                                                                   lVar36 + lVar33 +
                                                                                            lVar53)
                                                                           << 0x10));
                                                      if ((uint)ABS(fVar68) < 0x7f800001) {
                                                        uVar31 = (ushort)((int)fVar68 + 0x7fff +
                                                                          ((uint)fVar68 >> 0x10 & 1)
                                                                         >> 0x10);
                                                      }
                                                      else {
                                                        uVar31 = (ushort)((uint)fVar68 >> 0x10) |
                                                                 0x40;
                                                      }
                                                      *(ushort *)
                                                       ((long)pvVar9 +
                                                       lVar54 * 2 + lVar40 + lVar38 + lVar55) =
                                                           uVar31;
                                                      lVar54 = lVar54 + 1;
                                                    } while (lVar39 != lVar54);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                } while (lVar34 != lVar35);
                                                return;
                                              }
                                              goto LAB_00131211;
                                            }
                                            goto LAB_001311f5;
                                          }
                                        }
                                      }
                                    }
                                  }
                                  else {
LAB_00130d4a:
                                    if ((gVar2 != GGML_TYPE_F16) || (pgVar47->type != GGML_TYPE_F32)
                                       ) {
                                      pgStack_470 = (ggml_tensor *)0x13123d;
                                      pgVar45 = pgVar47;
                                      ggml_compute_forward_log_cold_1();
                                      pgStack_470 = pgVar44;
                                      pgStack_478 = pgVar42;
                                      pgStack_480 = pgVar47;
                                      uVar48 = (uint)pgVar45;
                                      uVar32 = uVar48 & 0xffffffc0;
                                      uStack_500 = 0;
                                      uStack_4f8 = 0;
                                      uStack_4f0 = 0;
                                      uStack_4e8 = 0;
                                      uStack_4e0 = 0;
                                      uStack_4d8 = 0;
                                      uStack_4d0 = 0;
                                      uStack_4c8 = 0;
                                      uStack_540 = 0;
                                      uStack_538 = 0;
                                      uStack_530 = 0;
                                      uStack_528 = 0;
                                      uStack_520 = 0;
                                      uStack_518 = 0;
                                      uStack_510 = 0;
                                      uStack_508 = 0;
                                      uStack_580 = 0;
                                      uStack_578 = 0;
                                      uStack_570 = 0;
                                      uStack_568 = 0;
                                      uStack_560 = 0;
                                      uStack_558 = 0;
                                      uStack_550 = 0;
                                      uStack_548 = 0;
                                      auStack_5c0 = ZEXT1664(ZEXT816(0));
                                      if (0 < (int)uVar32) {
                                        uVar51 = 0;
                                        lVar39 = in_R9;
                                        uVar52 = in_RCX;
                                        do {
                                          lVar35 = 0;
                                          do {
                                            auVar67 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                                           (lVar39 + lVar35),
                                                                          *(undefined1 (*) [64])
                                                                           (uVar52 + lVar35),
                                                                          *(undefined1 (*) [64])
                                                                           (auStack_5c0 + lVar35));
                                            *(undefined1 (*) [64])(auStack_5c0 + lVar35) = auVar67;
                                            lVar35 = lVar35 + 0x40;
                                          } while (lVar35 != 0x100);
                                          uVar51 = uVar51 + 0x40;
                                          lVar39 = lVar39 + 0x100;
                                          uVar52 = uVar52 + 0x100;
                                        } while (uVar51 < uVar32);
                                      }
                                      lVar39 = 0;
                                      do {
                                        auVar67 = vaddps_avx512f(*(undefined1 (*) [64])
                                                                  (auStack_5c0 + lVar39),
                                                                 *(undefined1 (*) [64])
                                                                  ((long)&uStack_540 + lVar39));
                                        *(undefined1 (*) [64])(auStack_5c0 + lVar39) = auVar67;
                                        lVar39 = lVar39 + 0x40;
                                      } while (lVar39 == 0x40);
                                      auVar67._8_8_ = uStack_578;
                                      auVar67._0_8_ = uStack_580;
                                      auVar67._16_8_ = uStack_570;
                                      auVar67._24_8_ = uStack_568;
                                      auVar67._32_8_ = uStack_560;
                                      auVar67._40_8_ = uStack_558;
                                      auVar67._48_8_ = uStack_550;
                                      auVar67._56_8_ = uStack_548;
                                      auVar67 = vaddps_avx512f(auStack_5c0,auVar67);
                                      auVar59 = vextractf64x4_avx512f(auVar67,1);
                                      auVar67 = vaddps_avx512f(auVar67,ZEXT3264(auVar59));
                                      auVar70._0_4_ = auVar67._0_4_ + auVar67._16_4_;
                                      auVar70._4_4_ = auVar67._4_4_ + auVar67._20_4_;
                                      auVar70._8_4_ = auVar67._8_4_ + auVar67._24_4_;
                                      auVar70._12_4_ = auVar67._12_4_ + auVar67._28_4_;
                                      auVar69 = vshufpd_avx(auVar70,auVar70,1);
                                      auVar71._0_4_ = auVar70._0_4_ + auVar69._0_4_;
                                      auVar71._4_4_ = auVar70._4_4_ + auVar69._4_4_;
                                      auVar71._8_4_ = auVar70._8_4_ + auVar69._8_4_;
                                      auVar71._12_4_ = auVar70._12_4_ + auVar69._12_4_;
                                      auVar69 = vhaddps_avx(auVar71,auVar71);
                                      auVar67 = ZEXT1664(auVar69);
                                      if (uVar32 != uVar48) {
                                        lVar39 = (long)(int)uVar32;
                                        do {
                                          auVar69 = vfmadd231ss_fma(auVar67._0_16_,
                                                                    ZEXT416(*(uint *)(in_RCX + 
                                                  lVar39 * 4)),
                                                  ZEXT416(*(uint *)(in_R9 + lVar39 * 4)));
                                          auVar67 = ZEXT1664(auVar69);
                                          lVar39 = lVar39 + 1;
                                        } while (lVar39 < (int)uVar48);
                                      }
                                      pgVar43->type = auVar67._0_4_;
                                      return;
                                    }
                                    pgStack_470 = (ggml_tensor *)0x130d64;
                                    cVar30 = ggml_is_contiguous_1(pgVar43);
                                    if (cVar30 != '\0') {
                                      pgStack_470 = (ggml_tensor *)0x130d74;
                                      cVar30 = ggml_is_contiguous_1(pgVar47);
                                      if (cVar30 != '\0') {
                                        pgStack_470 = (ggml_tensor *)0x130d87;
                                        cVar30 = ggml_are_same_shape(pgVar43,pgVar47);
                                        if (cVar30 != '\0') {
                                          if (pgVar47->nb[0] == 4) {
                                            if (pgVar43->nb[0] == 2) {
                                              lStack_460 = pgVar43->ne[1];
                                              lStack_468 = pgVar43->ne[2];
                                              sStack_438 = pgVar43->nb[1];
                                              sStack_440 = pgVar43->nb[2];
                                              sStack_448 = pgVar43->nb[3];
                                              lVar39 = pgVar47->ne[0];
                                              sStack_450 = pgVar47->nb[1];
                                              sStack_458 = pgVar47->nb[2];
                                              sStack_418 = pgVar47->nb[3];
                                              gVar2 = pgVar50->type;
                                              iVar3 = *(int *)&pgVar50->field_0x4;
                                              pgStack_470 = (ggml_tensor *)0x130dff;
                                              lVar35 = ggml_nrows(pgVar43);
                                              lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3;
                                              lVar34 = (int)gVar2 * lVar36;
                                              sStack_430 = lVar36 + lVar34;
                                              if (lVar35 <= (long)sStack_430) {
                                                sStack_430 = lVar35;
                                              }
                                              if (lVar34 < (long)sStack_430) {
                                                lStack_468 = lStack_468 * lStack_460;
                                                do {
                                                  lVar35 = (lVar34 % lStack_468) / lStack_460;
                                                  lVar36 = (lVar34 % lStack_468) % lStack_460;
                                                  if (0 < lVar39) {
                                                    lVar53 = (lVar34 / lStack_468) * sStack_418;
                                                    lVar55 = lVar35 * sStack_458;
                                                    lVar38 = lVar36 * sStack_450;
                                                    lVar33 = (lVar34 / lStack_468) * sStack_448;
                                                    lVar35 = lVar35 * sStack_440;
                                                    lVar36 = lVar36 * sStack_438;
                                                    pvVar9 = pgStack_420->data;
                                                    pvVar13 = pgStack_428->data;
                                                    lVar40 = 0;
                                                    do {
                                                      pgStack_470 = (ggml_tensor *)0x130ebf;
                                                      fVar68 = logf(*(float *)(&ggml_table_f32_f16 +
                                                                              (ulong)*(ushort *)
                                                                                      ((long)pvVar13
                                                                                      + lVar40 * 2 +
                                                                                        lVar35 + 
                                                  lVar36 + lVar33) * 4));
                                                  *(float *)((long)pvVar9 +
                                                            lVar40 * 4 + lVar55 + lVar38 + lVar53) =
                                                       fVar68;
                                                  lVar40 = lVar40 + 1;
                                                  } while (lVar39 != lVar40);
                                                  }
                                                  lVar34 = lVar34 + 1;
                                                } while (lVar34 != sStack_430);
                                              }
                                              return;
                                            }
                                            goto LAB_00131211;
                                          }
LAB_001311f5:
                                          pcVar37 = "nb0 == sizeof(dst_t)";
                                          uVar41 = 0x55;
                                          goto LAB_0013122b;
                                        }
                                      }
                                    }
                                  }
                                  pcVar37 = 
                                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                  ;
                                  uVar41 = 0x51;
LAB_0013122b:
                                  pgStack_470 = (ggml_tensor *)0x131232;
                                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                             ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                                }
                                pgStack_3e8 = (ggml_tensor *)0x1304d8;
                                cVar30 = ggml_is_contiguous_1(pgVar14);
                                if (cVar30 != '\0') {
                                  pgStack_3e8 = (ggml_tensor *)0x1304e8;
                                  cVar30 = ggml_is_contiguous_1(pgVar46);
                                  if (cVar30 != '\0') {
                                    pgStack_3e8 = (ggml_tensor *)0x1304fb;
                                    cVar30 = ggml_are_same_shape(pgVar14,pgVar46);
                                    if (cVar30 != '\0') {
                                      if (pgVar46->nb[0] == 4) {
                                        if (pgVar14->nb[0] == 2) {
                                          lStack_3d8 = pgVar14->ne[1];
                                          lStack_3e0 = pgVar14->ne[2];
                                          sStack_3b0 = pgVar14->nb[1];
                                          sStack_3b8 = pgVar14->nb[2];
                                          sStack_3c0 = pgVar14->nb[3];
                                          lVar39 = pgVar46->ne[0];
                                          sStack_3c8 = pgVar46->nb[1];
                                          sStack_3d0 = pgVar46->nb[2];
                                          sStack_390 = pgVar46->nb[3];
                                          gVar2 = pgVar49->type;
                                          iVar3 = *(int *)&pgVar49->field_0x4;
                                          pgStack_3e8 = (ggml_tensor *)0x130573;
                                          lVar35 = ggml_nrows(pgVar14);
                                          lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3;
                                          lVar34 = (int)gVar2 * lVar36;
                                          sStack_3a8 = lVar36 + lVar34;
                                          if (lVar35 <= (long)sStack_3a8) {
                                            sStack_3a8 = lVar35;
                                          }
                                          if (lVar34 < (long)sStack_3a8) {
                                            lStack_3e0 = lStack_3e0 * lStack_3d8;
                                            do {
                                              lVar35 = (lVar34 % lStack_3e0) / lStack_3d8;
                                              lVar36 = (lVar34 % lStack_3e0) % lStack_3d8;
                                              if (0 < lVar39) {
                                                lVar53 = (lVar34 / lStack_3e0) * sStack_390;
                                                lVar55 = lVar35 * sStack_3d0;
                                                lVar38 = lVar36 * sStack_3c8;
                                                lVar33 = (lVar34 / lStack_3e0) * sStack_3c0;
                                                lVar35 = lVar35 * sStack_3b8;
                                                lVar36 = lVar36 * sStack_3b0;
                                                pvVar9 = pgStack_398->data;
                                                pvVar13 = pgStack_3a0->data;
                                                lVar40 = 0;
                                                do {
                                                  pgStack_3e8 = (ggml_tensor *)0x130633;
                                                  fVar68 = cosf(*(float *)(&ggml_table_f32_f16 +
                                                                          (ulong)*(ushort *)
                                                                                  ((long)pvVar13 +
                                                                                  lVar40 * 2 +
                                                                                  lVar35 + lVar36 + 
                                                  lVar33) * 4));
                                                  *(float *)((long)pvVar9 +
                                                            lVar40 * 4 + lVar55 + lVar38 + lVar53) =
                                                       fVar68;
                                                  lVar40 = lVar40 + 1;
                                                } while (lVar39 != lVar40);
                                              }
                                              lVar34 = lVar34 + 1;
                                            } while (lVar34 != sStack_3a8);
                                          }
                                          return;
                                        }
                                        goto LAB_00130985;
                                      }
LAB_00130969:
                                      pcVar37 = "nb0 == sizeof(dst_t)";
                                      uVar41 = 0x55;
                                      goto LAB_0013099f;
                                    }
                                  }
                                }
                              }
                              pcVar37 = 
                              "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                              ;
                              uVar41 = 0x51;
LAB_0013099f:
                              pgStack_3e8 = (ggml_tensor *)0x1309a6;
                              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                         ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                            }
                            pgStack_360 = (ggml_tensor *)0x12fc4c;
                            cVar30 = ggml_is_contiguous_1(pgVar43);
                            if (cVar30 != '\0') {
                              pgStack_360 = (ggml_tensor *)0x12fc5c;
                              cVar30 = ggml_is_contiguous_1(pgVar47);
                              if (cVar30 != '\0') {
                                pgStack_360 = (ggml_tensor *)0x12fc6f;
                                cVar30 = ggml_are_same_shape(pgVar43,pgVar47);
                                if (cVar30 != '\0') {
                                  if (pgVar47->nb[0] == 4) {
                                    if (pgVar43->nb[0] == 2) {
                                      lStack_350 = pgVar43->ne[1];
                                      lStack_358 = pgVar43->ne[2];
                                      sStack_328 = pgVar43->nb[1];
                                      sStack_330 = pgVar43->nb[2];
                                      sStack_338 = pgVar43->nb[3];
                                      lVar39 = pgVar47->ne[0];
                                      sStack_340 = pgVar47->nb[1];
                                      sStack_348 = pgVar47->nb[2];
                                      sStack_308 = pgVar47->nb[3];
                                      gVar2 = pgVar50->type;
                                      iVar3 = *(int *)&pgVar50->field_0x4;
                                      pgStack_360 = (ggml_tensor *)0x12fce7;
                                      lVar35 = ggml_nrows(pgVar43);
                                      lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3;
                                      lVar34 = (int)gVar2 * lVar36;
                                      sStack_320 = lVar36 + lVar34;
                                      if (lVar35 <= (long)sStack_320) {
                                        sStack_320 = lVar35;
                                      }
                                      if (lVar34 < (long)sStack_320) {
                                        lStack_358 = lStack_358 * lStack_350;
                                        do {
                                          lVar35 = (lVar34 % lStack_358) / lStack_350;
                                          lVar36 = (lVar34 % lStack_358) % lStack_350;
                                          if (0 < lVar39) {
                                            lVar53 = (lVar34 / lStack_358) * sStack_308;
                                            lVar55 = lVar35 * sStack_348;
                                            lVar38 = lVar36 * sStack_340;
                                            lVar33 = (lVar34 / lStack_358) * sStack_338;
                                            lVar35 = lVar35 * sStack_330;
                                            lVar36 = lVar36 * sStack_328;
                                            pvVar9 = pgStack_310->data;
                                            pvVar13 = pgStack_318->data;
                                            lVar40 = 0;
                                            do {
                                              pgStack_360 = (ggml_tensor *)0x12fda7;
                                              fVar68 = sinf(*(float *)(&ggml_table_f32_f16 +
                                                                      (ulong)*(ushort *)
                                                                              ((long)pvVar13 +
                                                                              lVar40 * 2 +
                                                                              lVar35 + lVar36 + 
                                                  lVar33) * 4));
                                              *(float *)((long)pvVar9 +
                                                        lVar40 * 4 + lVar55 + lVar38 + lVar53) =
                                                   fVar68;
                                              lVar40 = lVar40 + 1;
                                            } while (lVar39 != lVar40);
                                          }
                                          lVar34 = lVar34 + 1;
                                        } while (lVar34 != sStack_320);
                                      }
                                      return;
                                    }
                                    goto LAB_001300f9;
                                  }
LAB_001300dd:
                                  pcVar37 = "nb0 == sizeof(dst_t)";
                                  uVar41 = 0x55;
                                  goto LAB_00130113;
                                }
                              }
                            }
                          }
                          pcVar37 = 
                          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                          ;
                          uVar41 = 0x51;
LAB_00130113:
                          pgStack_360 = (ggml_tensor *)0x13011a;
                          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                     ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                        }
                        pgStack_2d8 = (ggml_tensor *)0x12f378;
                        cVar30 = ggml_is_contiguous_1(pgVar14);
                        if (cVar30 != '\0') {
                          pgStack_2d8 = (ggml_tensor *)0x12f388;
                          cVar30 = ggml_is_contiguous_1(pgVar46);
                          if (cVar30 != '\0') {
                            pgStack_2d8 = (ggml_tensor *)0x12f39b;
                            cVar30 = ggml_are_same_shape(pgVar14,pgVar46);
                            if (cVar30 != '\0') {
                              if (pgVar46->nb[0] == 4) {
                                if (pgVar14->nb[0] == 2) {
                                  lStack_2c8 = pgVar14->ne[1];
                                  lStack_2d0 = pgVar14->ne[2];
                                  sStack_2a0 = pgVar14->nb[1];
                                  sStack_2a8 = pgVar14->nb[2];
                                  sStack_2b0 = pgVar14->nb[3];
                                  lVar39 = pgVar46->ne[0];
                                  sStack_2b8 = pgVar46->nb[1];
                                  sStack_2c0 = pgVar46->nb[2];
                                  sStack_280 = pgVar46->nb[3];
                                  gVar2 = pgVar49->type;
                                  iVar3 = *(int *)&pgVar49->field_0x4;
                                  pgStack_2d8 = (ggml_tensor *)0x12f413;
                                  lVar35 = ggml_nrows(pgVar14);
                                  lVar36 = ((long)iVar3 + -1 + lVar35) / (long)iVar3;
                                  lVar34 = (int)gVar2 * lVar36;
                                  sStack_298 = lVar36 + lVar34;
                                  if (lVar35 <= (long)sStack_298) {
                                    sStack_298 = lVar35;
                                  }
                                  if (lVar34 < (long)sStack_298) {
                                    lStack_2d0 = lStack_2d0 * lStack_2c8;
                                    do {
                                      lVar35 = (lVar34 % lStack_2d0) / lStack_2c8;
                                      lVar36 = (lVar34 % lStack_2d0) % lStack_2c8;
                                      if (0 < lVar39) {
                                        lVar53 = (lVar34 / lStack_2d0) * sStack_280;
                                        lVar55 = lVar35 * sStack_2c0;
                                        lVar38 = lVar36 * sStack_2b8;
                                        lVar33 = (lVar34 / lStack_2d0) * sStack_2b0;
                                        lVar35 = lVar35 * sStack_2a8;
                                        lVar36 = lVar36 * sStack_2a0;
                                        pvVar9 = pgStack_288->data;
                                        pvVar13 = pgStack_290->data;
                                        lVar40 = 0;
                                        do {
                                          fVar68 = *(float *)(&ggml_table_f32_f16 +
                                                             (ulong)*(ushort *)
                                                                     ((long)pvVar13 +
                                                                     lVar40 * 2 +
                                                                     lVar35 + lVar36 + lVar33) * 4);
                                          if (fVar68 < 0.0) {
                                            pgStack_2d8 = (ggml_tensor *)0x12f4e7;
                                            fVar68 = sqrtf(fVar68);
                                          }
                                          else {
                                            auVar69 = vsqrtss_avx(ZEXT416((uint)fVar68),
                                                                  ZEXT416((uint)fVar68));
                                            fVar68 = auVar69._0_4_;
                                          }
                                          *(float *)((long)pvVar9 +
                                                    lVar40 * 4 + lVar55 + lVar38 + lVar53) = fVar68;
                                          lVar40 = lVar40 + 1;
                                        } while (lVar39 != lVar40);
                                      }
                                      lVar34 = lVar34 + 1;
                                    } while (lVar34 != sStack_298);
                                  }
                                  return;
                                }
                                goto LAB_0012f86d;
                              }
LAB_0012f851:
                              pcVar37 = "nb0 == sizeof(dst_t)";
                              uVar41 = 0x55;
                              goto LAB_0012f887;
                            }
                          }
                        }
                      }
                      pcVar37 = 
                      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                      ;
                      uVar41 = 0x51;
LAB_0012f887:
                      pgStack_2d8 = (ggml_tensor *)0x12f88e;
                      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                 ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                    }
                    cVar30 = ggml_is_contiguous_1(pgVar43);
                    if (((cVar30 != '\0') &&
                        (cVar30 = ggml_is_contiguous_1(pgVar45), cVar30 != '\0')) &&
                       (cVar30 = ggml_are_same_shape(pgVar43,pgVar45), cVar30 != '\0')) {
                      if (pgVar45->nb[0] == 4) {
                        if (pgVar43->nb[0] == 2) {
                          lVar39 = pgVar43->ne[1];
                          lVar35 = pgVar43->ne[2];
                          sVar6 = pgVar43->nb[1];
                          sVar7 = pgVar43->nb[2];
                          sVar8 = pgVar43->nb[3];
                          lVar36 = pgVar45->ne[0];
                          sVar10 = pgVar45->nb[1];
                          sVar11 = pgVar45->nb[2];
                          sVar12 = pgVar45->nb[3];
                          gVar2 = pgVar44->type;
                          iVar3 = *(int *)&pgVar44->field_0x4;
                          lVar33 = ggml_nrows(pgVar43);
                          lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                          lVar53 = (int)gVar2 * lVar34;
                          lVar34 = lVar34 + lVar53;
                          if (lVar33 <= lVar34) {
                            lVar34 = lVar33;
                          }
                          if (lVar53 < lVar34) {
                            lVar35 = lVar35 * lVar39;
                            pvVar9 = pgVar45->data;
                            pvVar13 = pgVar43->data;
                            do {
                              lVar33 = lVar53 / lVar35;
                              lVar38 = lVar53 % lVar35;
                              lVar55 = lVar38 / lVar39;
                              lVar38 = lVar38 % lVar39;
                              if (0 < lVar36) {
                                lVar40 = 0;
                                do {
                                  *(float *)((long)pvVar9 +
                                            lVar40 * 4 +
                                            lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                                       *(float *)(&ggml_table_f32_f16 +
                                                 (ulong)*(ushort *)
                                                         ((long)pvVar13 +
                                                         lVar40 * 2 +
                                                         lVar55 * sVar7 +
                                                         lVar38 * sVar6 + lVar33 * sVar8) * 4) *
                                       *(float *)(&ggml_table_f32_f16 +
                                                 (ulong)*(ushort *)
                                                         ((long)pvVar13 +
                                                         lVar40 * 2 +
                                                         lVar55 * sVar7 +
                                                         lVar38 * sVar6 + lVar33 * sVar8) * 4);
                                  lVar40 = lVar40 + 1;
                                } while (lVar36 != lVar40);
                              }
                              lVar53 = lVar53 + 1;
                            } while (lVar53 != lVar34);
                          }
                          return;
                        }
                        goto LAB_0012ef6d;
                      }
LAB_0012ef51:
                      pcVar37 = "nb0 == sizeof(dst_t)";
                      uVar41 = 0x55;
                      goto LAB_0012ef87;
                    }
                  }
                  pcVar37 = 
                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                  ;
                  uVar41 = 0x51;
LAB_0012ef87:
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                             ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                }
                cVar30 = ggml_is_contiguous_1(pgVar42);
                if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0'))
                   && (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                  if (pgVar44->nb[0] == 4) {
                    if (pgVar42->nb[0] == 2) {
                      lVar39 = pgVar42->ne[1];
                      lVar35 = pgVar42->ne[2];
                      sVar6 = pgVar42->nb[1];
                      sVar7 = pgVar42->nb[2];
                      sVar8 = pgVar42->nb[3];
                      lVar36 = pgVar44->ne[0];
                      sVar10 = pgVar44->nb[1];
                      sVar11 = pgVar44->nb[2];
                      sVar12 = pgVar44->nb[3];
                      gVar2 = pgVar43->type;
                      iVar3 = *(int *)&pgVar43->field_0x4;
                      lVar33 = ggml_nrows();
                      lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                      lVar53 = (int)gVar2 * lVar34;
                      lVar34 = lVar34 + lVar53;
                      if (lVar33 <= lVar34) {
                        lVar34 = lVar33;
                      }
                      if (lVar53 < lVar34) {
                        lVar35 = lVar35 * lVar39;
                        pvVar9 = pgVar44->data;
                        pvVar13 = pgVar42->data;
                        do {
                          lVar33 = lVar53 / lVar35;
                          lVar38 = lVar53 % lVar35;
                          lVar55 = lVar38 / lVar39;
                          lVar38 = lVar38 % lVar39;
                          if (0 < lVar36) {
                            lVar40 = 0;
                            do {
                              auVar69._0_4_ =
                                   (*(float *)(&ggml_table_f32_f16 +
                                              (ulong)*(ushort *)
                                                      ((long)pvVar13 +
                                                      lVar40 * 2 +
                                                      lVar55 * sVar7 +
                                                      lVar38 * sVar6 + lVar33 * sVar8) * 4) + 3.0) /
                                   6.0;
                              auVar69._4_12_ = SUB6012((undefined1  [60])0x0,0);
                              auVar69 = vmaxss_avx(auVar69,ZEXT816(0) << 0x40);
                              auVar69 = vminss_avx(auVar69,SUB6416(ZEXT464(0x3f800000),0));
                              *(float *)((long)pvVar9 +
                                        lVar40 * 4 +
                                        lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                                   *(float *)(&ggml_table_f32_f16 +
                                             (ulong)*(ushort *)
                                                     ((long)pvVar13 +
                                                     lVar40 * 2 +
                                                     lVar55 * sVar7 +
                                                     lVar38 * sVar6 + lVar33 * sVar8) * 4) *
                                   auVar69._0_4_;
                              lVar40 = lVar40 + 1;
                            } while (lVar36 != lVar40);
                          }
                          lVar53 = lVar53 + 1;
                        } while (lVar53 != lVar34);
                      }
                      return;
                    }
                    goto LAB_0012e6e5;
                  }
LAB_0012e6c9:
                  pcVar37 = "nb0 == sizeof(dst_t)";
                  uVar41 = 0x55;
                  goto LAB_0012e6ff;
                }
              }
              pcVar37 = 
              "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
              ;
              uVar41 = 0x51;
LAB_0012e6ff:
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                         ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
            }
            cVar30 = ggml_is_contiguous_1(pgVar44);
            if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
               (cVar30 = ggml_are_same_shape(pgVar44,pgVar43), cVar30 != '\0')) {
              if (pgVar43->nb[0] == 4) {
                if (pgVar44->nb[0] == 2) {
                  lVar39 = pgVar44->ne[1];
                  lVar35 = pgVar44->ne[2];
                  sVar6 = pgVar44->nb[1];
                  sVar7 = pgVar44->nb[2];
                  sVar8 = pgVar44->nb[3];
                  lVar36 = pgVar43->ne[0];
                  sVar10 = pgVar43->nb[1];
                  sVar11 = pgVar43->nb[2];
                  sVar12 = pgVar43->nb[3];
                  gVar2 = pgVar42->type;
                  iVar3 = *(int *)&pgVar42->field_0x4;
                  lVar33 = ggml_nrows(pgVar44);
                  lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                  lVar53 = (int)gVar2 * lVar34;
                  lVar34 = lVar34 + lVar53;
                  if (lVar33 <= lVar34) {
                    lVar34 = lVar33;
                  }
                  if (lVar53 < lVar34) {
                    lVar35 = lVar35 * lVar39;
                    pvVar9 = pgVar43->data;
                    pvVar13 = pgVar44->data;
                    do {
                      lVar33 = lVar53 / lVar35;
                      lVar38 = lVar53 % lVar35;
                      lVar55 = lVar38 / lVar39;
                      lVar38 = lVar38 % lVar39;
                      if (0 < lVar36) {
                        lVar40 = 0;
                        do {
                          fVar68 = expf(*(float *)(&ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar13 +
                                                          lVar40 * 2 +
                                                          lVar55 * sVar7 +
                                                          lVar38 * sVar6 + lVar33 * sVar8) * 4));
                          *(float *)((long)pvVar9 +
                                    lVar40 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12
                                    ) = fVar68;
                          lVar40 = lVar40 + 1;
                        } while (lVar36 != lVar40);
                      }
                      lVar53 = lVar53 + 1;
                    } while (lVar53 != lVar34);
                  }
                  return;
                }
                goto LAB_0012dd7a;
              }
LAB_0012dd5e:
              pcVar37 = "nb0 == sizeof(dst_t)";
              uVar41 = 0x55;
              goto LAB_0012dd94;
            }
          }
          pcVar37 = 
          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
          ;
          uVar41 = 0x51;
LAB_0012dd94:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                     ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
        }
        cVar30 = ggml_is_contiguous_1(pgVar43);
        if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
           (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
          if (pgVar42->nb[0] == 4) {
            if (pgVar43->nb[0] == 2) {
              lVar39 = pgVar43->ne[1];
              lVar35 = pgVar43->ne[2];
              sVar6 = pgVar43->nb[1];
              sVar7 = pgVar43->nb[2];
              sVar8 = pgVar43->nb[3];
              lVar36 = pgVar42->ne[0];
              sVar10 = pgVar42->nb[1];
              sVar11 = pgVar42->nb[2];
              sVar12 = pgVar42->nb[3];
              gVar2 = dst->type;
              iVar3 = *(int *)&dst->field_0x4;
              lVar33 = ggml_nrows();
              lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
              lVar53 = (int)gVar2 * lVar34;
              lVar34 = lVar34 + lVar53;
              if (lVar33 <= lVar34) {
                lVar34 = lVar33;
              }
              if (lVar53 < lVar34) {
                lVar35 = lVar35 * lVar39;
                pvVar9 = pgVar42->data;
                pvVar13 = pgVar43->data;
                do {
                  lVar33 = lVar53 / lVar35;
                  lVar38 = lVar53 % lVar35;
                  lVar55 = lVar38 / lVar39;
                  lVar38 = lVar38 % lVar39;
                  if (0 < lVar36) {
                    lVar40 = 0;
                    do {
                      auVar74._0_4_ =
                           (*(float *)(&ggml_table_f32_f16 +
                                      (ulong)*(ushort *)
                                              ((long)pvVar13 +
                                              lVar40 * 2 +
                                              lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8) * 4)
                           + 3.0) / 6.0;
                      auVar74._4_12_ = SUB6012((undefined1  [60])0x0,0);
                      auVar69 = vmaxss_avx(auVar74,ZEXT816(0) << 0x40);
                      auVar69 = vminss_avx(auVar69,SUB6416(ZEXT464(0x3f800000),0));
                      *(int *)((long)pvVar9 +
                              lVar40 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                           auVar69._0_4_;
                      lVar40 = lVar40 + 1;
                    } while (lVar36 != lVar40);
                  }
                  lVar53 = lVar53 + 1;
                } while (lVar53 != lVar34);
              }
              return;
            }
            goto LAB_0012d49a;
          }
LAB_0012d47e:
          pcVar37 = "nb0 == sizeof(dst_t)";
          uVar41 = 0x55;
          goto LAB_0012d4b4;
        }
      }
      pcVar37 = 
      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
      uVar41 = 0x51;
LAB_0012d4b4:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                 ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
    }
    cVar30 = ggml_is_contiguous_1(pgVar42);
    if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
       (cVar30 = ggml_are_same_shape(pgVar42,dst), cVar30 != '\0')) {
      if (dst->nb[0] == 4) {
        if (pgVar42->nb[0] == 2) {
          lVar39 = pgVar42->ne[1];
          lVar35 = pgVar42->ne[2];
          sVar6 = pgVar42->nb[1];
          sVar7 = pgVar42->nb[2];
          sVar8 = pgVar42->nb[3];
          lVar36 = dst->ne[0];
          sVar10 = dst->nb[1];
          sVar11 = dst->nb[2];
          sVar12 = dst->nb[3];
          iVar3 = params->ith;
          iVar4 = params->nth;
          lVar33 = ggml_nrows(pgVar42);
          lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
          lVar53 = iVar3 * lVar34;
          lVar34 = lVar34 + lVar53;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar53 < lVar34) {
            lVar35 = lVar35 * lVar39;
            pvVar9 = dst->data;
            pvVar13 = pgVar42->data;
            do {
              lVar33 = lVar53 / lVar35;
              lVar38 = lVar53 % lVar35;
              lVar55 = lVar38 / lVar39;
              lVar38 = lVar38 % lVar39;
              if (0 < lVar36) {
                lVar40 = 0;
                do {
                  fVar68 = expf(-*(float *)(&ggml_table_f32_f16 +
                                           (ulong)*(ushort *)
                                                   ((long)pvVar13 +
                                                   lVar40 * 2 +
                                                   lVar55 * sVar7 + lVar38 * sVar6 + lVar33 * sVar8)
                                           * 4));
                  *(float *)((long)pvVar9 +
                            lVar40 * 4 + lVar55 * sVar11 + lVar38 * sVar10 + lVar33 * sVar12) =
                       1.0 / (fVar68 + 1.0);
                  lVar40 = lVar40 + 1;
                } while (lVar36 != lVar40);
              }
              lVar53 = lVar53 + 1;
            } while (lVar53 != lVar34);
          }
          return;
        }
        goto LAB_0012cb55;
      }
LAB_0012cb39:
      pcVar37 = "nb0 == sizeof(dst_t)";
      uVar41 = 0x55;
      goto LAB_0012cb6f;
    }
  }
  pcVar37 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar41 = 0x51;
LAB_0012cb6f:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
}

Assistant:

void ggml_compute_forward_sigmoid(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_sigmoid>(params, dst);
}